

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O2

void embree::avx2::CurveNiMBIntersectorK<8,4>::
     intersect_h<embree::avx2::SweepCurve1IntersectorK<embree::HermiteCurveT,4>,embree::avx2::Intersect1KEpilog1<4,true>>
               (Precalculations *pre,RayHitK<4> *ray,size_t k,RayQueryContext *context,
               Primitive *prim)

{
  float *pfVar1;
  ulong uVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  Primitive PVar7;
  undefined4 uVar8;
  Geometry *pGVar9;
  __int_type_conflict _Var10;
  long lVar11;
  long lVar12;
  long lVar13;
  RTCFilterFunctionN p_Var14;
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  float fVar17;
  float fVar18;
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  int iVar23;
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  uint uVar84;
  ulong uVar85;
  ulong uVar86;
  uint uVar87;
  long lVar88;
  long lVar89;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined4 uVar90;
  uint uVar91;
  undefined8 unaff_R13;
  bool bVar92;
  float fVar93;
  undefined1 auVar95 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar105 [16];
  undefined8 uVar94;
  float fVar124;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  undefined1 auVar113 [32];
  undefined1 auVar114 [32];
  undefined1 auVar115 [32];
  undefined1 auVar116 [32];
  undefined1 auVar96 [16];
  undefined1 auVar117 [32];
  undefined1 auVar102 [16];
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar106 [16];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar118 [32];
  undefined1 auVar123 [64];
  undefined1 extraout_var_00 [60];
  undefined1 auVar126 [16];
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  float fVar125;
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  undefined1 auVar144 [32];
  undefined1 auVar145 [32];
  undefined1 auVar146 [32];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar151 [16];
  float fVar150;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  float fVar149;
  undefined1 auVar156 [16];
  float fVar163;
  float fVar165;
  float fVar169;
  float fVar171;
  float fVar173;
  undefined1 auVar157 [32];
  float fVar164;
  float fVar166;
  float fVar167;
  float fVar168;
  float fVar170;
  float fVar172;
  float fVar174;
  float fVar175;
  undefined1 auVar158 [32];
  undefined1 auVar159 [32];
  undefined1 auVar160 [32];
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [32];
  undefined1 auVar192 [32];
  undefined1 auVar193 [32];
  undefined1 auVar194 [32];
  undefined1 auVar195 [32];
  undefined1 auVar229 [16];
  undefined1 auVar196 [32];
  undefined1 auVar197 [32];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [32];
  undefined1 auVar210 [32];
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  undefined1 auVar214 [32];
  undefined1 auVar215 [32];
  undefined1 auVar216 [32];
  undefined1 auVar217 [32];
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar228 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  undefined1 auVar232 [32];
  undefined1 auVar233 [32];
  undefined1 auVar234 [32];
  undefined1 auVar235 [32];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [32];
  undefined1 auVar239 [32];
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  undefined1 auVar243 [32];
  undefined1 auVar244 [32];
  undefined1 auVar245 [16];
  undefined1 auVar246 [32];
  undefined1 auVar247 [32];
  undefined1 auVar248 [32];
  undefined1 auVar249 [32];
  undefined1 auVar250 [32];
  undefined1 auVar251 [32];
  undefined1 auVar252 [32];
  undefined1 auVar253 [64];
  undefined1 auVar255 [32];
  undefined1 auVar256 [64];
  float fVar257;
  float fVar264;
  float fVar265;
  undefined1 auVar258 [16];
  float fVar267;
  float fVar268;
  float fVar269;
  undefined1 auVar259 [32];
  float fVar266;
  undefined1 auVar261 [32];
  undefined1 auVar262 [32];
  undefined1 auVar263 [64];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  float fVar279;
  undefined1 auVar272 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [28];
  undefined1 auVar275 [32];
  float fVar280;
  undefined1 auVar276 [32];
  undefined1 auVar277 [32];
  undefined1 auVar278 [64];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar283 [32];
  undefined1 auVar284 [64];
  undefined1 auVar285 [16];
  undefined1 auVar286 [16];
  float fVar288;
  float fVar289;
  undefined1 auVar287 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_c84;
  undefined1 local_c80 [8];
  float fStack_c78;
  float fStack_c74;
  float fStack_c70;
  float fStack_c6c;
  float fStack_c68;
  uint uStack_be4;
  float fStack_bcc;
  float fStack_bc8;
  float fStack_bc4;
  RTCFilterFunctionNArguments local_bb0;
  undefined1 local_b80 [8];
  float fStack_b78;
  float fStack_b74;
  undefined1 auStack_b70 [16];
  undefined1 local_b60 [32];
  undefined1 local_b40 [32];
  undefined1 (*local_b08) [16];
  undefined1 local_b00 [32];
  undefined1 local_ae0 [32];
  undefined1 local_ac0 [32];
  float local_aa0;
  float fStack_a9c;
  float fStack_a98;
  float fStack_a94;
  undefined4 uStack_a90;
  undefined4 uStack_a8c;
  undefined4 uStack_a88;
  undefined4 uStack_a84;
  undefined1 local_a80 [32];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  float fStack_9b0;
  float fStack_9ac;
  float fStack_9a8;
  undefined4 uStack_9a4;
  undefined1 local_9a0 [8];
  float fStack_998;
  float fStack_994;
  float fStack_990;
  float fStack_98c;
  float fStack_988;
  undefined1 local_970 [16];
  undefined1 local_960 [16];
  Primitive *local_948;
  ulong local_940;
  undefined1 auStack_938 [24];
  undefined1 local_920 [32];
  undefined1 local_900 [8];
  float fStack_8f8;
  float fStack_8f4;
  float fStack_8f0;
  float fStack_8ec;
  float fStack_8e8;
  float fStack_8e4;
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  undefined1 local_860 [8];
  float fStack_858;
  float fStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_840 [32];
  undefined1 local_820 [32];
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  uint local_7a0;
  uint uStack_79c;
  uint uStack_798;
  uint uStack_794;
  uint local_790;
  uint uStack_78c;
  uint uStack_788;
  uint uStack_784;
  RTCHitN local_780 [16];
  undefined1 auStack_770 [16];
  undefined4 local_760;
  undefined4 uStack_75c;
  undefined4 uStack_758;
  undefined4 uStack_754;
  undefined1 local_750 [16];
  undefined1 local_740 [16];
  undefined8 local_730;
  undefined8 uStack_728;
  undefined1 local_720 [16];
  uint local_710;
  uint uStack_70c;
  uint uStack_708;
  uint uStack_704;
  uint uStack_700;
  uint uStack_6fc;
  uint uStack_6f8;
  uint uStack_6f4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  undefined4 uStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [8];
  float fStack_678;
  float fStack_674;
  float fStack_670;
  float fStack_66c;
  float fStack_668;
  undefined4 uStack_664;
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  undefined1 local_610 [16];
  undefined1 local_600 [32];
  undefined1 local_5e0 [32];
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  undefined1 local_560 [32];
  float local_540;
  float fStack_53c;
  float fStack_538;
  float fStack_534;
  float fStack_530;
  float fStack_52c;
  float fStack_528;
  float fStack_524;
  float local_520;
  float fStack_51c;
  float fStack_518;
  float fStack_514;
  float fStack_510;
  float fStack_50c;
  float fStack_508;
  float fStack_504;
  undefined1 local_500 [32];
  undefined1 local_4e0 [32];
  undefined1 local_4c0 [32];
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  float fStack_484;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined1 local_420 [32];
  float local_400;
  float fStack_3fc;
  float fStack_3f8;
  float fStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  float fStack_3e4;
  float local_3e0;
  float fStack_3dc;
  float fStack_3d8;
  float fStack_3d4;
  undefined4 uStack_3d0;
  undefined4 uStack_3cc;
  undefined4 uStack_3c8;
  float fStack_3c4;
  undefined1 local_3c0 [32];
  float local_3a0;
  float fStack_39c;
  float fStack_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float fStack_388;
  float fStack_384;
  undefined1 local_380 [32];
  undefined1 local_360 [32];
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  float fStack_288;
  float fStack_284;
  undefined1 local_280 [32];
  undefined8 local_260;
  undefined8 uStack_258;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 local_240;
  undefined8 uStack_238;
  undefined8 uStack_230;
  undefined8 uStack_228;
  undefined8 local_220;
  undefined8 uStack_218;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  int aiStack_138 [66];
  undefined1 extraout_var [60];
  undefined1 auVar254 [32];
  undefined1 auVar260 [32];
  
  PVar7 = prim[1];
  uVar85 = (ulong)(byte)PVar7;
  auVar3._8_8_ = 0;
  auVar3._0_8_ = *(ulong *)(prim + uVar85 * 4 + 6);
  auVar20 = vpmovsxbd_avx2(auVar3);
  auVar4._8_8_ = 0;
  auVar4._0_8_ = *(ulong *)(prim + uVar85 * 5 + 6);
  auVar108 = vpmovsxbd_avx2(auVar4);
  auVar101._8_8_ = 0;
  auVar101._0_8_ = *(ulong *)(prim + uVar85 * 6 + 6);
  auVar116 = vpmovsxbd_avx2(auVar101);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar85 * 0xf + 6);
  auVar215 = vpmovsxbd_avx2(auVar5);
  lVar88 = uVar85 * 0x25;
  auVar141._1_3_ = 0;
  auVar141[0] = PVar7;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar7 * 0x10 + 6);
  auVar21 = vpmovsxbd_avx2(auVar6);
  auVar133._8_8_ = 0;
  auVar133._0_8_ = *(ulong *)(prim + uVar85 * 0x11 + 6);
  auVar22 = vpmovsxbd_avx2(auVar133);
  auVar155._8_8_ = 0;
  auVar155._0_8_ = *(ulong *)(prim + uVar85 * 0x1a + 6);
  auVar140 = vpmovsxbd_avx2(auVar155);
  auVar98._8_8_ = 0;
  auVar98._0_8_ = *(ulong *)(prim + uVar85 * 0x1b + 6);
  auVar234 = vpmovsxbd_avx2(auVar98);
  auVar229._8_8_ = 0;
  auVar229._0_8_ = *(ulong *)(prim + uVar85 * 0x1c + 6);
  auVar232 = vpmovsxbd_avx2(auVar229);
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x10
                        );
  auVar3 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x20);
  auVar4 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x40)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0x50)),0x10);
  fVar93 = *(float *)(prim + lVar88 + 0x12);
  auVar101 = vsubps_avx(auVar3,*(undefined1 (*) [16])(prim + lVar88 + 6));
  fVar125 = (*(float *)(ray + k * 4 + 0x70) - *(float *)(prim + lVar88 + 0x16)) *
            *(float *)(prim + lVar88 + 0x1a);
  auVar3 = vinsertps_avx(auVar4,ZEXT416(*(uint *)(ray + k * 4 + 0x60)),0x20);
  auVar245._0_4_ = fVar93 * auVar101._0_4_;
  auVar245._4_4_ = fVar93 * auVar101._4_4_;
  auVar245._8_4_ = fVar93 * auVar101._8_4_;
  auVar245._12_4_ = fVar93 * auVar101._12_4_;
  auVar258._0_4_ = fVar93 * auVar3._0_4_;
  auVar258._4_4_ = fVar93 * auVar3._4_4_;
  auVar258._8_4_ = fVar93 * auVar3._8_4_;
  auVar258._12_4_ = fVar93 * auVar3._12_4_;
  auVar108 = vcvtdq2ps_avx(auVar108);
  auVar116 = vcvtdq2ps_avx(auVar116);
  auVar21 = vcvtdq2ps_avx(auVar21);
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar15 = vcvtdq2ps_avx(auVar234);
  auVar196 = vcvtdq2ps_avx(auVar232);
  auVar3 = vmovshdup_avx(auVar258);
  auVar209._0_8_ = auVar3._0_8_;
  auVar209._8_8_ = auVar209._0_8_;
  auVar209._16_8_ = auVar209._0_8_;
  auVar209._24_8_ = auVar209._0_8_;
  auVar3 = vshufps_avx(auVar258,auVar258,0xaa);
  fVar93 = auVar3._0_4_;
  fVar124 = auVar3._4_4_;
  auVar195._4_4_ = fVar124 * auVar116._4_4_;
  auVar195._0_4_ = fVar93 * auVar116._0_4_;
  auVar195._8_4_ = fVar93 * auVar116._8_4_;
  auVar195._12_4_ = fVar124 * auVar116._12_4_;
  auVar195._16_4_ = fVar93 * auVar116._16_4_;
  auVar195._20_4_ = fVar124 * auVar116._20_4_;
  auVar195._24_4_ = fVar93 * auVar116._24_4_;
  auVar195._28_4_ = auVar232._28_4_;
  auVar232._4_4_ = fVar124 * auVar22._4_4_;
  auVar232._0_4_ = fVar93 * auVar22._0_4_;
  auVar232._8_4_ = fVar93 * auVar22._8_4_;
  auVar232._12_4_ = fVar124 * auVar22._12_4_;
  auVar232._16_4_ = fVar93 * auVar22._16_4_;
  auVar232._20_4_ = fVar124 * auVar22._20_4_;
  auVar232._24_4_ = fVar93 * auVar22._24_4_;
  auVar232._28_4_ = auVar234._28_4_;
  auVar234._4_4_ = auVar196._4_4_ * fVar124;
  auVar234._0_4_ = auVar196._0_4_ * fVar93;
  auVar234._8_4_ = auVar196._8_4_ * fVar93;
  auVar234._12_4_ = auVar196._12_4_ * fVar124;
  auVar234._16_4_ = auVar196._16_4_ * fVar93;
  auVar234._20_4_ = auVar196._20_4_ * fVar124;
  auVar234._24_4_ = auVar196._24_4_ * fVar93;
  auVar234._28_4_ = fVar124;
  auVar4 = vfmadd231ps_fma(auVar195,auVar209,auVar108);
  auVar101 = vfmadd231ps_fma(auVar232,auVar209,auVar21);
  auVar5 = vfmadd231ps_fma(auVar234,auVar15,auVar209);
  auVar3 = vshufps_avx(auVar245,auVar245,0xaa);
  fVar93 = auVar3._0_4_;
  auVar210._0_4_ = fVar93 * auVar116._0_4_;
  fVar124 = auVar3._4_4_;
  auVar210._4_4_ = fVar124 * auVar116._4_4_;
  auVar210._8_4_ = fVar93 * auVar116._8_4_;
  auVar210._12_4_ = fVar124 * auVar116._12_4_;
  auVar210._16_4_ = fVar93 * auVar116._16_4_;
  auVar210._20_4_ = fVar124 * auVar116._20_4_;
  auVar210._24_4_ = fVar93 * auVar116._24_4_;
  auVar210._28_4_ = 0;
  auVar19._4_4_ = fVar124 * auVar22._4_4_;
  auVar19._0_4_ = fVar93 * auVar22._0_4_;
  auVar19._8_4_ = fVar93 * auVar22._8_4_;
  auVar19._12_4_ = fVar124 * auVar22._12_4_;
  auVar19._16_4_ = fVar93 * auVar22._16_4_;
  auVar19._20_4_ = fVar124 * auVar22._20_4_;
  auVar19._24_4_ = fVar93 * auVar22._24_4_;
  auVar19._28_4_ = auVar22._28_4_;
  auVar24._4_4_ = auVar196._4_4_ * fVar124;
  auVar24._0_4_ = auVar196._0_4_ * fVar93;
  auVar24._8_4_ = auVar196._8_4_ * fVar93;
  auVar24._12_4_ = auVar196._12_4_ * fVar124;
  auVar24._16_4_ = auVar196._16_4_ * fVar93;
  auVar24._20_4_ = auVar196._20_4_ * fVar124;
  auVar24._24_4_ = auVar196._24_4_ * fVar93;
  auVar24._28_4_ = auVar116._28_4_;
  auVar3 = vmovshdup_avx(auVar245);
  auVar107._0_8_ = auVar3._0_8_;
  auVar107._8_8_ = auVar107._0_8_;
  auVar107._16_8_ = auVar107._0_8_;
  auVar107._24_8_ = auVar107._0_8_;
  auVar3 = vfmadd231ps_fma(auVar210,auVar107,auVar108);
  auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 7 + 6));
  auVar6 = vfmadd231ps_fma(auVar19,auVar107,auVar21);
  auVar196 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0xb + 6));
  auVar133 = vfmadd231ps_fma(auVar24,auVar107,auVar15);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 9 + 6));
  auVar234 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0xd + 6));
  auVar108 = vcvtdq2ps_avx(auVar20);
  auVar116 = vcvtdq2ps_avx(auVar215);
  auVar21 = vcvtdq2ps_avx(auVar140);
  auVar259._4_4_ = auVar258._0_4_;
  auVar259._0_4_ = auVar258._0_4_;
  auVar259._8_4_ = auVar258._0_4_;
  auVar259._12_4_ = auVar258._0_4_;
  auVar259._16_4_ = auVar258._0_4_;
  auVar259._20_4_ = auVar258._0_4_;
  auVar259._24_4_ = auVar258._0_4_;
  auVar259._28_4_ = auVar258._0_4_;
  auVar4 = vfmadd231ps_fma(ZEXT1632(auVar4),auVar259,auVar108);
  auVar101 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar259,auVar116);
  auVar258 = vfmadd231ps_fma(ZEXT1632(auVar5),auVar21,auVar259);
  auVar246._4_4_ = auVar245._0_4_;
  auVar246._0_4_ = auVar245._0_4_;
  auVar246._8_4_ = auVar245._0_4_;
  auVar246._12_4_ = auVar245._0_4_;
  auVar246._16_4_ = auVar245._0_4_;
  auVar246._20_4_ = auVar245._0_4_;
  auVar246._24_4_ = auVar245._0_4_;
  auVar246._28_4_ = auVar245._0_4_;
  auVar245 = vfmadd231ps_fma(ZEXT1632(auVar3),auVar246,auVar108);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar6),auVar246,auVar116);
  local_ae0 = ZEXT1632(auVar3);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar246,auVar21);
  local_ac0 = ZEXT1632(auVar3);
  local_6e0._8_4_ = 0x7fffffff;
  local_6e0._0_8_ = 0x7fffffff7fffffff;
  local_6e0._12_4_ = 0x7fffffff;
  local_6e0._16_4_ = 0x7fffffff;
  local_6e0._20_4_ = 0x7fffffff;
  local_6e0._24_4_ = 0x7fffffff;
  local_6e0._28_4_ = 0x7fffffff;
  auVar108 = vandps_avx(ZEXT1632(auVar4),local_6e0);
  auVar191._8_4_ = 0x219392ef;
  auVar191._0_8_ = 0x219392ef219392ef;
  auVar191._12_4_ = 0x219392ef;
  auVar191._16_4_ = 0x219392ef;
  auVar191._20_4_ = 0x219392ef;
  auVar191._24_4_ = 0x219392ef;
  auVar191._28_4_ = 0x219392ef;
  auVar108 = vcmpps_avx(auVar108,auVar191,1);
  auVar116 = vblendvps_avx(ZEXT1632(auVar4),auVar191,auVar108);
  auVar108 = vandps_avx(ZEXT1632(auVar101),local_6e0);
  auVar108 = vcmpps_avx(auVar108,auVar191,1);
  auVar21 = vblendvps_avx(ZEXT1632(auVar101),auVar191,auVar108);
  auVar287._4_4_ = fVar125;
  auVar287._0_4_ = fVar125;
  auVar287._8_4_ = fVar125;
  auVar287._12_4_ = fVar125;
  auVar287._16_4_ = fVar125;
  auVar287._20_4_ = fVar125;
  auVar287._24_4_ = fVar125;
  auVar287._28_4_ = fVar125;
  auVar108 = vcvtdq2ps_avx(auVar22);
  auVar22 = vcvtdq2ps_avx(auVar196);
  auVar22 = vsubps_avx(auVar22,auVar108);
  auVar5 = vfmadd213ps_fma(auVar22,auVar287,auVar108);
  auVar108 = vcvtdq2ps_avx(auVar15);
  auVar22 = vcvtdq2ps_avx(auVar234);
  auVar22 = vsubps_avx(auVar22,auVar108);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x12 + 6));
  auVar6 = vfmadd213ps_fma(auVar22,auVar287,auVar108);
  auVar108 = vcvtdq2ps_avx(auVar15);
  auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x16 + 6));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar22 = vsubps_avx(auVar22,auVar108);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x14 + 6));
  auVar133 = vfmadd213ps_fma(auVar22,auVar287,auVar108);
  auVar108 = vcvtdq2ps_avx(auVar15);
  auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x18 + 6));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar22 = vsubps_avx(auVar22,auVar108);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x1d + 6));
  auVar155 = vfmadd213ps_fma(auVar22,auVar287,auVar108);
  auVar108 = vcvtdq2ps_avx(auVar15);
  auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x21 + 6));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar22 = vsubps_avx(auVar22,auVar108);
  auVar15 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x1f + 6));
  auVar98 = vfmadd213ps_fma(auVar22,auVar287,auVar108);
  auVar108 = vcvtdq2ps_avx(auVar15);
  auVar22 = vpmovsxwd_avx2(*(undefined1 (*) [16])(prim + uVar85 * 0x23 + 6));
  auVar22 = vcvtdq2ps_avx(auVar22);
  auVar22 = vsubps_avx(auVar22,auVar108);
  auVar229 = vfmadd213ps_fma(auVar22,auVar287,auVar108);
  auVar108 = vandps_avx(ZEXT1632(auVar258),local_6e0);
  auVar108 = vcmpps_avx(auVar108,auVar191,1);
  auVar22 = vrcpps_avx(auVar116);
  auVar108 = vblendvps_avx(ZEXT1632(auVar258),auVar191,auVar108);
  auVar140._8_4_ = 0x3f800000;
  auVar140._0_8_ = 0x3f8000003f800000;
  auVar140._12_4_ = 0x3f800000;
  auVar140._16_4_ = 0x3f800000;
  auVar140._20_4_ = 0x3f800000;
  auVar140._24_4_ = 0x3f800000;
  auVar140._28_4_ = 0x3f800000;
  auVar3 = vfnmadd213ps_fma(auVar116,auVar22,auVar140);
  auVar116 = vrcpps_avx(auVar21);
  auVar3 = vfmadd132ps_fma(ZEXT1632(auVar3),auVar22,auVar22);
  auVar22 = vrcpps_avx(auVar108);
  auVar4 = vfnmadd213ps_fma(auVar21,auVar116,auVar140);
  auVar4 = vfmadd132ps_fma(ZEXT1632(auVar4),auVar116,auVar116);
  auVar101 = vfnmadd213ps_fma(auVar108,auVar22,auVar140);
  auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar22,auVar22);
  auVar108 = vsubps_avx(ZEXT1632(auVar5),ZEXT1632(auVar245));
  auVar21._4_4_ = auVar3._4_4_ * auVar108._4_4_;
  auVar21._0_4_ = auVar3._0_4_ * auVar108._0_4_;
  auVar21._8_4_ = auVar3._8_4_ * auVar108._8_4_;
  auVar21._12_4_ = auVar3._12_4_ * auVar108._12_4_;
  auVar21._16_4_ = auVar108._16_4_ * 0.0;
  auVar21._20_4_ = auVar108._20_4_ * 0.0;
  auVar21._24_4_ = auVar108._24_4_ * 0.0;
  auVar21._28_4_ = auVar108._28_4_;
  auVar108 = vsubps_avx(ZEXT1632(auVar6),ZEXT1632(auVar245));
  auVar22._4_4_ = auVar3._4_4_ * auVar108._4_4_;
  auVar22._0_4_ = auVar3._0_4_ * auVar108._0_4_;
  auVar22._8_4_ = auVar3._8_4_ * auVar108._8_4_;
  auVar22._12_4_ = auVar3._12_4_ * auVar108._12_4_;
  auVar22._16_4_ = auVar108._16_4_ * 0.0;
  auVar22._20_4_ = auVar108._20_4_ * 0.0;
  auVar22._24_4_ = auVar108._24_4_ * 0.0;
  auVar22._28_4_ = 0x3f800000;
  auVar108 = vsubps_avx(ZEXT1632(auVar133),local_ae0);
  auVar15._4_4_ = auVar4._4_4_ * auVar108._4_4_;
  auVar15._0_4_ = auVar4._0_4_ * auVar108._0_4_;
  auVar15._8_4_ = auVar4._8_4_ * auVar108._8_4_;
  auVar15._12_4_ = auVar4._12_4_ * auVar108._12_4_;
  auVar15._16_4_ = auVar108._16_4_ * 0.0;
  auVar15._20_4_ = auVar108._20_4_ * 0.0;
  auVar15._24_4_ = auVar108._24_4_ * 0.0;
  auVar15._28_4_ = auVar108._28_4_;
  auVar108 = vsubps_avx(ZEXT1632(auVar155),local_ae0);
  auVar215._0_4_ = auVar4._0_4_ * auVar108._0_4_;
  auVar215._4_4_ = auVar4._4_4_ * auVar108._4_4_;
  auVar215._8_4_ = auVar4._8_4_ * auVar108._8_4_;
  auVar215._12_4_ = auVar4._12_4_ * auVar108._12_4_;
  auVar215._16_4_ = auVar108._16_4_ * 0.0;
  auVar215._20_4_ = auVar108._20_4_ * 0.0;
  auVar215._24_4_ = auVar108._24_4_ * 0.0;
  auVar215._28_4_ = 0;
  auVar108 = vsubps_avx(ZEXT1632(auVar98),local_ac0);
  auVar196._4_4_ = auVar101._4_4_ * auVar108._4_4_;
  auVar196._0_4_ = auVar101._0_4_ * auVar108._0_4_;
  auVar196._8_4_ = auVar101._8_4_ * auVar108._8_4_;
  auVar196._12_4_ = auVar101._12_4_ * auVar108._12_4_;
  auVar196._16_4_ = auVar108._16_4_ * 0.0;
  auVar196._20_4_ = auVar108._20_4_ * 0.0;
  auVar196._24_4_ = auVar108._24_4_ * 0.0;
  auVar196._28_4_ = auVar108._28_4_;
  auVar108 = vsubps_avx(ZEXT1632(auVar229),local_ac0);
  auVar20._4_4_ = auVar101._4_4_ * auVar108._4_4_;
  auVar20._0_4_ = auVar101._0_4_ * auVar108._0_4_;
  auVar20._8_4_ = auVar101._8_4_ * auVar108._8_4_;
  auVar20._12_4_ = auVar101._12_4_ * auVar108._12_4_;
  auVar20._16_4_ = auVar108._16_4_ * 0.0;
  auVar20._20_4_ = auVar108._20_4_ * 0.0;
  auVar20._24_4_ = auVar108._24_4_ * 0.0;
  auVar20._28_4_ = auVar108._28_4_;
  auVar108 = vpminsd_avx2(auVar21,auVar22);
  auVar116 = vpminsd_avx2(auVar15,auVar215);
  auVar108 = vmaxps_avx(auVar108,auVar116);
  auVar116 = vpminsd_avx2(auVar196,auVar20);
  uVar90 = *(undefined4 *)(ray + k * 4 + 0x30);
  auVar247._4_4_ = uVar90;
  auVar247._0_4_ = uVar90;
  auVar247._8_4_ = uVar90;
  auVar247._12_4_ = uVar90;
  auVar247._16_4_ = uVar90;
  auVar247._20_4_ = uVar90;
  auVar247._24_4_ = uVar90;
  auVar247._28_4_ = uVar90;
  auVar116 = vmaxps_avx(auVar116,auVar247);
  auVar108 = vmaxps_avx(auVar108,auVar116);
  local_3c0._4_4_ = auVar108._4_4_ * 0.99999964;
  local_3c0._0_4_ = auVar108._0_4_ * 0.99999964;
  local_3c0._8_4_ = auVar108._8_4_ * 0.99999964;
  local_3c0._12_4_ = auVar108._12_4_ * 0.99999964;
  local_3c0._16_4_ = auVar108._16_4_ * 0.99999964;
  local_3c0._20_4_ = auVar108._20_4_ * 0.99999964;
  local_3c0._24_4_ = auVar108._24_4_ * 0.99999964;
  local_3c0._28_4_ = auVar108._28_4_;
  auVar108 = vpmaxsd_avx2(auVar21,auVar22);
  auVar116 = vpmaxsd_avx2(auVar15,auVar215);
  auVar108 = vminps_avx(auVar108,auVar116);
  auVar116 = vpmaxsd_avx2(auVar196,auVar20);
  uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar157._4_4_ = uVar90;
  auVar157._0_4_ = uVar90;
  auVar157._8_4_ = uVar90;
  auVar157._12_4_ = uVar90;
  auVar157._16_4_ = uVar90;
  auVar157._20_4_ = uVar90;
  auVar157._24_4_ = uVar90;
  auVar157._28_4_ = uVar90;
  auVar116 = vminps_avx(auVar116,auVar157);
  auVar108 = vminps_avx(auVar108,auVar116);
  auVar116._4_4_ = auVar108._4_4_ * 1.0000004;
  auVar116._0_4_ = auVar108._0_4_ * 1.0000004;
  auVar116._8_4_ = auVar108._8_4_ * 1.0000004;
  auVar116._12_4_ = auVar108._12_4_ * 1.0000004;
  auVar116._16_4_ = auVar108._16_4_ * 1.0000004;
  auVar116._20_4_ = auVar108._20_4_ * 1.0000004;
  auVar116._24_4_ = auVar108._24_4_ * 1.0000004;
  auVar116._28_4_ = auVar108._28_4_;
  auVar141[4] = PVar7;
  auVar141._5_3_ = 0;
  auVar141[8] = PVar7;
  auVar141._9_3_ = 0;
  auVar141[0xc] = PVar7;
  auVar141._13_3_ = 0;
  auVar141[0x10] = PVar7;
  auVar141._17_3_ = 0;
  auVar141[0x14] = PVar7;
  auVar141._21_3_ = 0;
  auVar141[0x18] = PVar7;
  auVar141._25_3_ = 0;
  auVar141[0x1c] = PVar7;
  auVar141._29_3_ = 0;
  auVar108 = vcmpps_avx(local_3c0,auVar116,2);
  auVar116 = vpcmpgtd_avx2(auVar141,_DAT_01fb4ba0);
  auVar108 = vandps_avx(auVar108,auVar116);
  uVar90 = vmovmskps_avx(auVar108);
  uVar85 = CONCAT44((int)((ulong)unaff_R13 >> 0x20),uVar90);
  auVar108._16_16_ = mm_lookupmask_ps._240_16_;
  auVar108._0_16_ = mm_lookupmask_ps._240_16_;
  local_560 = vblendps_avx(auVar108,ZEXT832(0) << 0x20,0x80);
  local_b08 = (undefined1 (*) [16])(mm_lookupmask_ps + (long)(1 << ((uint)k & 0x1f)) * 0x10);
  local_948 = prim;
LAB_01424499:
  if (uVar85 == 0) {
    return;
  }
  lVar88 = 0;
  for (uVar86 = uVar85; (uVar86 & 1) == 0; uVar86 = uVar86 >> 1 | 0x8000000000000000) {
    lVar88 = lVar88 + 1;
  }
  uVar91 = *(uint *)(local_948 + 2);
  local_7a0 = *(uint *)(local_948 + lVar88 * 4 + 6);
  local_940 = (ulong)local_7a0;
  pGVar9 = (context->scene->geometries).items[uVar91].ptr;
  uVar86 = (ulong)*(uint *)(*(long *)&pGVar9->field_0x58 +
                           local_940 *
                           pGVar9[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  fVar93 = (pGVar9->time_range).lower;
  fVar93 = pGVar9->fnumTimeSegments *
           ((*(float *)(ray + k * 4 + 0x70) - fVar93) / ((pGVar9->time_range).upper - fVar93));
  auVar3 = vroundss_avx(ZEXT416((uint)fVar93),ZEXT416((uint)fVar93),9);
  auVar3 = vminss_avx(auVar3,ZEXT416((uint)(pGVar9->fnumTimeSegments + -1.0)));
  auVar3 = vmaxss_avx(ZEXT816(0) << 0x20,auVar3);
  fVar93 = fVar93 - auVar3._0_4_;
  fVar125 = 1.0 - fVar93;
  _Var10 = pGVar9[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar89 = (long)(int)auVar3._0_4_ * 0x38;
  lVar11 = *(long *)(_Var10 + 0x10 + lVar89);
  lVar12 = *(long *)(_Var10 + 0x38 + lVar89);
  lVar13 = *(long *)(_Var10 + 0x48 + lVar89);
  pfVar1 = (float *)(lVar12 + lVar13 * uVar86);
  auVar95._0_4_ = fVar93 * *pfVar1;
  auVar95._4_4_ = fVar93 * pfVar1[1];
  auVar95._8_4_ = fVar93 * pfVar1[2];
  auVar95._12_4_ = fVar93 * pfVar1[3];
  lVar88 = uVar86 + 1;
  pfVar1 = (float *)(lVar12 + lVar13 * lVar88);
  auVar126._0_4_ = fVar93 * *pfVar1;
  auVar126._4_4_ = fVar93 * pfVar1[1];
  auVar126._8_4_ = fVar93 * pfVar1[2];
  auVar126._12_4_ = fVar93 * pfVar1[3];
  p_Var14 = pGVar9[4].occlusionFilterN;
  auVar202._4_4_ = fVar125;
  auVar202._0_4_ = fVar125;
  auVar202._8_4_ = fVar125;
  auVar202._12_4_ = fVar125;
  auVar6 = vfmadd231ps_fma(auVar95,auVar202,
                           *(undefined1 (*) [16])(*(long *)(_Var10 + lVar89) + lVar11 * uVar86));
  auVar133 = vfmadd231ps_fma(auVar126,auVar202,
                             *(undefined1 (*) [16])(*(long *)(_Var10 + lVar89) + lVar11 * lVar88));
  pfVar1 = (float *)(*(long *)(p_Var14 + lVar89 + 0x38) +
                    uVar86 * *(long *)(p_Var14 + lVar89 + 0x48));
  auVar151._0_4_ = fVar93 * *pfVar1;
  auVar151._4_4_ = fVar93 * pfVar1[1];
  auVar151._8_4_ = fVar93 * pfVar1[2];
  auVar151._12_4_ = fVar93 * pfVar1[3];
  pfVar1 = (float *)(*(long *)(p_Var14 + lVar89 + 0x38) +
                    *(long *)(p_Var14 + lVar89 + 0x48) * lVar88);
  auVar176._0_4_ = fVar93 * *pfVar1;
  auVar176._4_4_ = fVar93 * pfVar1[1];
  auVar176._8_4_ = fVar93 * pfVar1[2];
  auVar176._12_4_ = fVar93 * pfVar1[3];
  auVar101 = vfmadd231ps_fma(auVar151,auVar202,
                             *(undefined1 (*) [16])
                              (*(long *)(p_Var14 + lVar89) +
                              *(long *)(p_Var14 + lVar89 + 0x10) * uVar86));
  auVar5 = vfmadd231ps_fma(auVar176,auVar202,
                           *(undefined1 (*) [16])
                            (*(long *)(p_Var14 + lVar89) +
                            *(long *)(p_Var14 + lVar89 + 0x10) * lVar88));
  auVar3 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x10)),0x1c
                        );
  auVar4 = vinsertps_avx(auVar3,ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x28);
  uVar90 = *(undefined4 *)(ray + k * 4 + 0x40);
  auVar270._4_4_ = uVar90;
  auVar270._0_4_ = uVar90;
  auVar270._8_4_ = uVar90;
  auVar270._12_4_ = uVar90;
  fStack_6b0 = (float)uVar90;
  _local_6c0 = auVar270;
  fStack_6ac = (float)uVar90;
  fStack_6a8 = (float)uVar90;
  uStack_6a4 = uVar90;
  uVar90 = *(undefined4 *)(ray + k * 4 + 0x50);
  auVar272._4_4_ = uVar90;
  auVar272._0_4_ = uVar90;
  auVar272._8_4_ = uVar90;
  auVar272._12_4_ = uVar90;
  fStack_990 = (float)uVar90;
  _local_9a0 = auVar272;
  fStack_98c = (float)uVar90;
  fStack_988 = (float)uVar90;
  register0x0000155c = uVar90;
  auVar3 = vunpcklps_avx(auVar270,auVar272);
  fVar93 = *(float *)(ray + k * 4 + 0x60);
  auVar285._4_4_ = fVar93;
  auVar285._0_4_ = fVar93;
  auVar285._8_4_ = fVar93;
  auVar285._12_4_ = fVar93;
  fStack_9b0 = fVar93;
  _local_9c0 = auVar285;
  fStack_9ac = fVar93;
  fStack_9a8 = fVar93;
  uStack_9a4 = fVar93;
  local_9d0 = vinsertps_avx(auVar3,auVar285,0x28);
  auVar218._8_4_ = 0xbeaaaaab;
  auVar218._0_8_ = 0xbeaaaaabbeaaaaab;
  auVar218._12_4_ = 0xbeaaaaab;
  auVar155 = vfnmadd213ps_fma(auVar101,auVar218,auVar6);
  auVar5 = vfmadd213ps_fma(auVar5,auVar218,auVar133);
  auVar219._0_4_ = (auVar133._0_4_ + auVar6._0_4_ + auVar155._0_4_ + auVar5._0_4_) * 0.25;
  auVar219._4_4_ = (auVar133._4_4_ + auVar6._4_4_ + auVar155._4_4_ + auVar5._4_4_) * 0.25;
  auVar219._8_4_ = (auVar133._8_4_ + auVar6._8_4_ + auVar155._8_4_ + auVar5._8_4_) * 0.25;
  auVar219._12_4_ = (auVar133._12_4_ + auVar6._12_4_ + auVar155._12_4_ + auVar5._12_4_) * 0.25;
  auVar3 = vsubps_avx(auVar219,auVar4);
  auVar3 = vdpps_avx(auVar3,local_9d0,0x7f);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar101 = vrcpss_avx(local_9e0,local_9e0);
  auVar98 = vfnmadd213ss_fma(auVar101,local_9e0,ZEXT416(0x40000000));
  local_3a0 = auVar3._0_4_ * auVar101._0_4_ * auVar98._0_4_;
  auVar228._4_4_ = local_3a0;
  auVar228._0_4_ = local_3a0;
  auVar228._8_4_ = local_3a0;
  auVar228._12_4_ = local_3a0;
  fStack_8f0 = local_3a0;
  _local_900 = auVar228;
  fStack_8ec = local_3a0;
  fStack_8e8 = local_3a0;
  fStack_8e4 = local_3a0;
  auVar3 = vfmadd231ps_fma(auVar4,local_9d0,auVar228);
  auVar3 = vblendps_avx(auVar3,_DAT_01f45a50,8);
  auVar4 = vsubps_avx(auVar6,auVar3);
  auVar101 = vsubps_avx(auVar5,auVar3);
  auVar5 = vsubps_avx(auVar155,auVar3);
  auVar6 = vsubps_avx(auVar133,auVar3);
  auVar3 = vmovshdup_avx(auVar4);
  uVar94 = auVar3._0_8_;
  auVar211._8_8_ = uVar94;
  auVar211._0_8_ = uVar94;
  auVar211._16_8_ = uVar94;
  auVar211._24_8_ = uVar94;
  auVar3 = vshufps_avx(auVar4,auVar4,0xaa);
  uVar94 = auVar3._0_8_;
  auVar238._8_8_ = uVar94;
  auVar238._0_8_ = uVar94;
  auVar238._16_8_ = uVar94;
  auVar238._24_8_ = uVar94;
  auVar3 = vshufps_avx(auVar4,auVar4,0xff);
  uVar94 = auVar3._0_8_;
  auVar248._8_8_ = uVar94;
  auVar248._0_8_ = uVar94;
  auVar248._16_8_ = uVar94;
  auVar248._24_8_ = uVar94;
  auVar3 = vmovshdup_avx(auVar5);
  uVar94 = auVar3._0_8_;
  auVar254._8_8_ = uVar94;
  auVar254._0_8_ = uVar94;
  auVar254._16_8_ = uVar94;
  auVar254._24_8_ = uVar94;
  auVar256 = ZEXT3264(auVar254);
  auVar3 = vshufps_avx(auVar5,auVar5,0xaa);
  uVar94 = auVar3._0_8_;
  auVar260._8_8_ = uVar94;
  auVar260._0_8_ = uVar94;
  auVar260._16_8_ = uVar94;
  auVar260._24_8_ = uVar94;
  auVar263 = ZEXT3264(auVar260);
  auVar3 = vshufps_avx(auVar5,auVar5,0xff);
  uVar94 = auVar3._0_8_;
  local_360._8_8_ = uVar94;
  local_360._0_8_ = uVar94;
  local_360._16_8_ = uVar94;
  local_360._24_8_ = uVar94;
  auVar3 = vmovshdup_avx(auVar101);
  local_1e0 = auVar3._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar3 = vshufps_avx(auVar101,auVar101,0xaa);
  local_520 = auVar3._0_4_;
  fStack_51c = auVar3._4_4_;
  auVar3 = vshufps_avx(auVar101,auVar101,0xff);
  local_200 = auVar3._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar3 = vmovshdup_avx(auVar6);
  local_220 = auVar3._0_8_;
  uStack_218 = local_220;
  uStack_210 = local_220;
  uStack_208 = local_220;
  auVar3 = vshufps_avx(auVar6,auVar6,0xaa);
  local_240 = auVar3._0_8_;
  uStack_238 = local_240;
  uStack_230 = local_240;
  uStack_228 = local_240;
  auVar3 = vshufps_avx(auVar6,auVar6,0xff);
  local_260 = auVar3._0_8_;
  uStack_258 = local_260;
  uStack_250 = local_260;
  uStack_248 = local_260;
  auVar3 = vfmadd231ps_fma(ZEXT432((uint)(fVar93 * fVar93)),_local_9a0,_local_9a0);
  auVar3 = vfmadd231ps_fma(ZEXT1632(auVar3),_local_6c0,_local_6c0);
  uVar90 = auVar3._0_4_;
  local_280._4_4_ = uVar90;
  local_280._0_4_ = uVar90;
  local_280._8_4_ = uVar90;
  local_280._12_4_ = uVar90;
  local_280._16_4_ = uVar90;
  local_280._20_4_ = uVar90;
  local_280._24_4_ = uVar90;
  local_280._28_4_ = uVar90;
  fVar93 = *(float *)(ray + k * 4 + 0x30);
  local_970 = ZEXT416((uint)local_3a0);
  local_3a0 = fVar93 - local_3a0;
  fStack_39c = local_3a0;
  fStack_398 = local_3a0;
  fStack_394 = local_3a0;
  fStack_390 = local_3a0;
  fStack_38c = local_3a0;
  fStack_388 = local_3a0;
  fStack_384 = local_3a0;
  uVar86 = 0;
  local_c84 = 1;
  local_ac0._0_16_ = auVar4;
  uVar90 = auVar4._0_4_;
  local_380._4_4_ = uVar90;
  local_380._0_4_ = uVar90;
  local_380._8_4_ = uVar90;
  local_380._12_4_ = uVar90;
  local_380._16_4_ = uVar90;
  local_380._20_4_ = uVar90;
  local_380._24_4_ = uVar90;
  local_380._28_4_ = uVar90;
  fVar124 = auVar5._0_4_;
  local_a40._4_4_ = fVar124;
  local_a40._0_4_ = fVar124;
  local_a40._8_4_ = fVar124;
  local_a40._12_4_ = fVar124;
  local_a40._16_4_ = fVar124;
  local_a40._20_4_ = fVar124;
  local_a40._24_4_ = fVar124;
  local_a40._28_4_ = fVar124;
  auVar278 = ZEXT3264(local_a40);
  local_ae0._0_16_ = auVar101;
  local_540 = auVar101._0_4_;
  fStack_53c = local_540;
  fStack_538 = local_540;
  fStack_534 = local_540;
  fStack_530 = local_540;
  fStack_52c = local_540;
  fStack_528 = local_540;
  fStack_524 = local_540;
  fVar125 = auVar6._0_4_;
  local_2a0 = fVar125;
  fStack_29c = fVar125;
  fStack_298 = fVar125;
  fStack_294 = fVar125;
  fStack_290 = fVar125;
  fStack_28c = fVar125;
  fStack_288 = fVar125;
  fStack_284 = fVar125;
  local_600 = vandps_avx(local_280,local_6e0);
  auVar3 = vsqrtss_avx(local_9e0,local_9e0);
  auVar4 = vsqrtss_avx(local_9e0,local_9e0);
  local_610 = ZEXT816(0x3f80000000000000);
  local_580 = auVar211;
  local_5a0 = auVar238;
  local_5c0 = auVar254;
  local_5e0 = auVar260;
  local_a20 = auVar248;
  uStack_79c = local_7a0;
  uStack_798 = local_7a0;
  uStack_794 = local_7a0;
  local_790 = uVar91;
  uStack_78c = uVar91;
  uStack_788 = uVar91;
  uStack_784 = uVar91;
  fStack_518 = local_520;
  fStack_514 = fStack_51c;
  fStack_510 = local_520;
  fStack_50c = fStack_51c;
  fStack_508 = local_520;
  fStack_504 = fStack_51c;
  do {
    auVar192._8_4_ = 0x3f800000;
    auVar192._0_8_ = 0x3f8000003f800000;
    auVar192._12_4_ = 0x3f800000;
    auVar192._16_4_ = 0x3f800000;
    auVar192._20_4_ = 0x3f800000;
    auVar192._24_4_ = 0x3f800000;
    auVar192._28_4_ = 0x3f800000;
    auVar101 = vmovshdup_avx(local_610);
    auVar101 = vsubps_avx(auVar101,local_610);
    fVar150 = auVar101._0_4_;
    fVar173 = fVar150 * 0.04761905;
    local_800._0_4_ = local_610._0_4_;
    local_800._4_4_ = local_800._0_4_;
    local_800._8_4_ = local_800._0_4_;
    local_800._12_4_ = local_800._0_4_;
    local_800._16_4_ = local_800._0_4_;
    local_800._20_4_ = local_800._0_4_;
    local_800._24_4_ = local_800._0_4_;
    local_800._28_4_ = local_800._0_4_;
    local_820._4_4_ = fVar150;
    local_820._0_4_ = fVar150;
    local_820._8_4_ = fVar150;
    local_820._12_4_ = fVar150;
    local_820._16_4_ = fVar150;
    local_820._20_4_ = fVar150;
    local_820._24_4_ = fVar150;
    local_820._28_4_ = fVar150;
    auVar101 = vfmadd231ps_fma(local_800,local_820,_DAT_01f7b040);
    auVar108 = vsubps_avx(auVar192,ZEXT1632(auVar101));
    fVar150 = auVar101._0_4_;
    auVar253._0_4_ = auVar278._0_4_ * fVar150;
    fVar164 = auVar101._4_4_;
    auVar253._4_4_ = auVar278._4_4_ * fVar164;
    fVar149 = auVar101._8_4_;
    auVar253._8_4_ = auVar278._8_4_ * fVar149;
    fVar166 = auVar101._12_4_;
    auVar253._12_4_ = auVar278._12_4_ * fVar166;
    auVar253._16_4_ = auVar278._16_4_ * 0.0;
    auVar253._20_4_ = auVar278._20_4_ * 0.0;
    auVar253._28_36_ = auVar263._28_36_;
    auVar253._24_4_ = auVar278._24_4_ * 0.0;
    auVar263._0_4_ = auVar254._0_4_ * fVar150;
    auVar263._4_4_ = auVar254._4_4_ * fVar164;
    auVar263._8_4_ = auVar254._8_4_ * fVar149;
    auVar263._12_4_ = auVar254._12_4_ * fVar166;
    auVar263._16_4_ = auVar254._16_4_ * 0.0;
    auVar263._20_4_ = auVar254._20_4_ * 0.0;
    auVar263._28_36_ = auVar256._28_36_;
    auVar263._24_4_ = auVar254._24_4_ * 0.0;
    auVar25._4_4_ = auVar260._4_4_ * fVar164;
    auVar25._0_4_ = auVar260._0_4_ * fVar150;
    auVar25._8_4_ = auVar260._8_4_ * fVar149;
    auVar25._12_4_ = auVar260._12_4_ * fVar166;
    auVar25._16_4_ = auVar260._16_4_ * 0.0;
    auVar25._20_4_ = auVar260._20_4_ * 0.0;
    auVar25._24_4_ = auVar260._24_4_ * 0.0;
    auVar25._28_4_ = auVar260._28_4_;
    auVar26._4_4_ = local_360._4_4_ * fVar164;
    auVar26._0_4_ = local_360._0_4_ * fVar150;
    auVar26._8_4_ = local_360._8_4_ * fVar149;
    auVar26._12_4_ = local_360._12_4_ * fVar166;
    auVar26._16_4_ = local_360._16_4_ * 0.0;
    auVar26._20_4_ = local_360._20_4_ * 0.0;
    auVar26._24_4_ = local_360._24_4_ * 0.0;
    auVar26._28_4_ = auVar254._28_4_;
    auVar101 = vfmadd231ps_fma(auVar253._0_32_,auVar108,local_380);
    auVar133 = vfmadd231ps_fma(auVar263._0_32_,auVar108,auVar211);
    auVar155 = vfmadd231ps_fma(auVar25,auVar108,auVar238);
    auVar98 = vfmadd231ps_fma(auVar26,auVar108,auVar248);
    auVar27._4_4_ = fVar164 * fStack_53c;
    auVar27._0_4_ = fVar150 * local_540;
    auVar27._8_4_ = fVar149 * fStack_538;
    auVar27._12_4_ = fVar166 * fStack_534;
    auVar27._16_4_ = fStack_530 * 0.0;
    auVar27._20_4_ = fStack_52c * 0.0;
    auVar27._24_4_ = fStack_528 * 0.0;
    auVar27._28_4_ = auVar248._28_4_;
    auVar82._8_8_ = uStack_1d8;
    auVar82._0_8_ = local_1e0;
    auVar82._16_8_ = uStack_1d0;
    auVar82._24_8_ = uStack_1c8;
    auVar28._4_4_ = (float)((ulong)local_1e0 >> 0x20) * fVar164;
    auVar28._0_4_ = (float)local_1e0 * fVar150;
    auVar28._8_4_ = (float)uStack_1d8 * fVar149;
    auVar28._12_4_ = (float)((ulong)uStack_1d8 >> 0x20) * fVar166;
    auVar28._16_4_ = (float)uStack_1d0 * 0.0;
    auVar28._20_4_ = (float)((ulong)uStack_1d0 >> 0x20) * 0.0;
    auVar28._24_4_ = (float)uStack_1c8 * 0.0;
    auVar28._28_4_ = auVar238._28_4_;
    auVar83._4_4_ = fVar164 * fStack_51c;
    auVar83._0_4_ = fVar150 * local_520;
    auVar83._8_4_ = fVar149 * fStack_518;
    auVar83._12_4_ = fVar166 * fStack_514;
    auVar83._16_4_ = fStack_510 * 0.0;
    auVar83._20_4_ = fStack_50c * 0.0;
    auVar83._24_4_ = fStack_508 * 0.0;
    auVar83._28_4_ = DAT_01f7b040._28_4_;
    auVar81._8_8_ = uStack_1f8;
    auVar81._0_8_ = local_200;
    auVar81._16_8_ = uStack_1f0;
    auVar81._24_8_ = uStack_1e8;
    auVar29._4_4_ = (float)((ulong)local_200 >> 0x20) * fVar164;
    auVar29._0_4_ = (float)local_200 * fVar150;
    auVar29._8_4_ = (float)uStack_1f8 * fVar149;
    auVar29._12_4_ = (float)((ulong)uStack_1f8 >> 0x20) * fVar166;
    auVar29._16_4_ = (float)uStack_1f0 * 0.0;
    auVar29._20_4_ = (float)((ulong)uStack_1f0 >> 0x20) * 0.0;
    auVar29._24_4_ = (float)uStack_1e8 * 0.0;
    auVar29._28_4_ = 0x3f800000;
    auVar229 = vfmadd231ps_fma(auVar27,auVar108,auVar278._0_32_);
    auVar258 = vfmadd231ps_fma(auVar28,auVar108,auVar254);
    auVar245 = vfmadd231ps_fma(auVar83,auVar108,auVar260);
    auVar95 = vfmadd231ps_fma(auVar29,auVar108,local_360);
    auVar30._4_4_ = fVar164 * fStack_29c;
    auVar30._0_4_ = fVar150 * local_2a0;
    auVar30._8_4_ = fVar149 * fStack_298;
    auVar30._12_4_ = fVar166 * fStack_294;
    auVar30._16_4_ = fStack_290 * 0.0;
    auVar30._20_4_ = fStack_28c * 0.0;
    auVar30._24_4_ = fStack_288 * 0.0;
    auVar30._28_4_ = auVar260._28_4_;
    auVar31._4_4_ = fVar164 * local_220._4_4_;
    auVar31._0_4_ = fVar150 * (float)local_220;
    auVar31._8_4_ = fVar149 * (float)uStack_218;
    auVar31._12_4_ = fVar166 * uStack_218._4_4_;
    auVar31._16_4_ = (float)uStack_210 * 0.0;
    auVar31._20_4_ = uStack_210._4_4_ * 0.0;
    auVar31._24_4_ = (float)uStack_208 * 0.0;
    auVar31._28_4_ = auVar254._28_4_;
    auVar32._28_4_ = auVar278._28_4_;
    auVar32._0_28_ =
         ZEXT1628(CONCAT412(auVar229._12_4_ * fVar166,
                            CONCAT48(auVar229._8_4_ * fVar149,
                                     CONCAT44(auVar229._4_4_ * fVar164,auVar229._0_4_ * fVar150))));
    auVar101 = vfmadd231ps_fma(auVar32,auVar108,ZEXT1632(auVar101));
    auVar133 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar166 * auVar258._12_4_,
                                                  CONCAT48(fVar149 * auVar258._8_4_,
                                                           CONCAT44(fVar164 * auVar258._4_4_,
                                                                    fVar150 * auVar258._0_4_)))),
                               auVar108,ZEXT1632(auVar133));
    auVar155 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar166 * auVar245._12_4_,
                                                  CONCAT48(fVar149 * auVar245._8_4_,
                                                           CONCAT44(fVar164 * auVar245._4_4_,
                                                                    fVar150 * auVar245._0_4_)))),
                               auVar108,ZEXT1632(auVar155));
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar166 * auVar95._12_4_,
                                                 CONCAT48(fVar149 * auVar95._8_4_,
                                                          CONCAT44(fVar164 * auVar95._4_4_,
                                                                   fVar150 * auVar95._0_4_)))),
                              auVar108,ZEXT1632(auVar98));
    auVar239._0_4_ = fVar150 * (float)local_240;
    auVar239._4_4_ = fVar164 * local_240._4_4_;
    auVar239._8_4_ = fVar149 * (float)uStack_238;
    auVar239._12_4_ = fVar166 * uStack_238._4_4_;
    auVar239._16_4_ = (float)uStack_230 * 0.0;
    auVar239._20_4_ = uStack_230._4_4_ * 0.0;
    auVar239._24_4_ = (float)uStack_228 * 0.0;
    auVar239._28_4_ = 0;
    auVar76._4_4_ = fStack_53c;
    auVar76._0_4_ = local_540;
    auVar76._8_4_ = fStack_538;
    auVar76._12_4_ = fStack_534;
    auVar76._16_4_ = fStack_530;
    auVar76._20_4_ = fStack_52c;
    auVar76._24_4_ = fStack_528;
    auVar76._28_4_ = fStack_524;
    auVar126 = vfmadd231ps_fma(auVar30,auVar108,auVar76);
    auVar229 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar126._12_4_ * fVar166,
                                                  CONCAT48(auVar126._8_4_ * fVar149,
                                                           CONCAT44(auVar126._4_4_ * fVar164,
                                                                    auVar126._0_4_ * fVar150)))),
                               auVar108,ZEXT1632(auVar229));
    auVar249._0_4_ = fVar150 * (float)local_260;
    auVar249._4_4_ = fVar164 * local_260._4_4_;
    auVar249._8_4_ = fVar149 * (float)uStack_258;
    auVar249._12_4_ = fVar166 * uStack_258._4_4_;
    auVar249._16_4_ = (float)uStack_250 * 0.0;
    auVar249._20_4_ = uStack_250._4_4_ * 0.0;
    auVar249._24_4_ = (float)uStack_248 * 0.0;
    auVar249._28_4_ = 0;
    auVar126 = vfmadd231ps_fma(auVar31,auVar108,auVar82);
    auVar77._4_4_ = fStack_51c;
    auVar77._0_4_ = local_520;
    auVar77._8_4_ = fStack_518;
    auVar77._12_4_ = fStack_514;
    auVar77._16_4_ = fStack_510;
    auVar77._20_4_ = fStack_50c;
    auVar77._24_4_ = fStack_508;
    auVar77._28_4_ = fStack_504;
    auVar151 = vfmadd231ps_fma(auVar239,auVar108,auVar77);
    auVar176 = vfmadd231ps_fma(auVar249,auVar108,auVar81);
    auVar33._28_4_ = local_360._28_4_;
    auVar33._0_28_ =
         ZEXT1628(CONCAT412(auVar176._12_4_ * fVar166,
                            CONCAT48(auVar176._8_4_ * fVar149,
                                     CONCAT44(auVar176._4_4_ * fVar164,auVar176._0_4_ * fVar150))));
    auVar258 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar126._12_4_ * fVar166,
                                                  CONCAT48(auVar126._8_4_ * fVar149,
                                                           CONCAT44(auVar126._4_4_ * fVar164,
                                                                    auVar126._0_4_ * fVar150)))),
                               auVar108,ZEXT1632(auVar258));
    auVar245 = vfmadd231ps_fma(ZEXT1632(CONCAT412(fVar166 * auVar151._12_4_,
                                                  CONCAT48(fVar149 * auVar151._8_4_,
                                                           CONCAT44(fVar164 * auVar151._4_4_,
                                                                    fVar150 * auVar151._0_4_)))),
                               auVar108,ZEXT1632(auVar245));
    auVar95 = vfmadd231ps_fma(auVar33,auVar108,ZEXT1632(auVar95));
    auVar34._28_4_ = (int)((ulong)uStack_1e8 >> 0x20);
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(auVar229._12_4_ * fVar166,
                            CONCAT48(auVar229._8_4_ * fVar149,
                                     CONCAT44(auVar229._4_4_ * fVar164,auVar229._0_4_ * fVar150))));
    auVar35._28_4_ = (int)((ulong)uStack_1c8 >> 0x20);
    auVar35._0_28_ =
         ZEXT1628(CONCAT412(fVar166 * auVar245._12_4_,
                            CONCAT48(fVar149 * auVar245._8_4_,
                                     CONCAT44(fVar164 * auVar245._4_4_,fVar150 * auVar245._0_4_))));
    auVar126 = vfmadd231ps_fma(auVar34,auVar108,ZEXT1632(auVar101));
    auVar151 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar258._12_4_ * fVar166,
                                                  CONCAT48(auVar258._8_4_ * fVar149,
                                                           CONCAT44(auVar258._4_4_ * fVar164,
                                                                    auVar258._0_4_ * fVar150)))),
                               auVar108,ZEXT1632(auVar133));
    auVar234 = ZEXT1632(auVar151);
    auVar151 = vfmadd231ps_fma(auVar35,auVar108,ZEXT1632(auVar155));
    auVar176 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar95._12_4_ * fVar166,
                                                  CONCAT48(auVar95._8_4_ * fVar149,
                                                           CONCAT44(auVar95._4_4_ * fVar164,
                                                                    auVar95._0_4_ * fVar150)))),
                               ZEXT1632(auVar98),auVar108);
    auVar108 = vsubps_avx(ZEXT1632(auVar229),ZEXT1632(auVar101));
    auVar116 = vsubps_avx(ZEXT1632(auVar258),ZEXT1632(auVar133));
    auVar21 = vsubps_avx(ZEXT1632(auVar245),ZEXT1632(auVar155));
    auVar22 = vsubps_avx(ZEXT1632(auVar95),ZEXT1632(auVar98));
    local_b00._0_4_ = fVar173 * auVar108._0_4_ * 3.0;
    local_b00._4_4_ = fVar173 * auVar108._4_4_ * 3.0;
    local_b00._8_4_ = fVar173 * auVar108._8_4_ * 3.0;
    local_b00._12_4_ = fVar173 * auVar108._12_4_ * 3.0;
    local_b00._16_4_ = fVar173 * auVar108._16_4_ * 3.0;
    local_b00._20_4_ = fVar173 * auVar108._20_4_ * 3.0;
    local_b00._24_4_ = fVar173 * auVar108._24_4_ * 3.0;
    local_b00._28_4_ = 0;
    local_8e0._0_4_ = fVar173 * auVar116._0_4_ * 3.0;
    local_8e0._4_4_ = fVar173 * auVar116._4_4_ * 3.0;
    local_8e0._8_4_ = fVar173 * auVar116._8_4_ * 3.0;
    local_8e0._12_4_ = fVar173 * auVar116._12_4_ * 3.0;
    local_8e0._16_4_ = fVar173 * auVar116._16_4_ * 3.0;
    local_8e0._20_4_ = fVar173 * auVar116._20_4_ * 3.0;
    local_8e0._24_4_ = fVar173 * auVar116._24_4_ * 3.0;
    local_8e0._28_4_ = 0;
    local_7e0._0_4_ = fVar173 * auVar21._0_4_ * 3.0;
    local_7e0._4_4_ = fVar173 * auVar21._4_4_ * 3.0;
    local_7e0._8_4_ = fVar173 * auVar21._8_4_ * 3.0;
    local_7e0._12_4_ = fVar173 * auVar21._12_4_ * 3.0;
    local_7e0._16_4_ = fVar173 * auVar21._16_4_ * 3.0;
    local_7e0._20_4_ = fVar173 * auVar21._20_4_ * 3.0;
    local_7e0._24_4_ = fVar173 * auVar21._24_4_ * 3.0;
    local_7e0._28_4_ = 0;
    fVar149 = fVar173 * auVar22._0_4_ * 3.0;
    fVar163 = fVar173 * auVar22._4_4_ * 3.0;
    auVar36._4_4_ = fVar163;
    auVar36._0_4_ = fVar149;
    fVar165 = fVar173 * auVar22._8_4_ * 3.0;
    auVar36._8_4_ = fVar165;
    fVar167 = fVar173 * auVar22._12_4_ * 3.0;
    auVar36._12_4_ = fVar167;
    fVar169 = fVar173 * auVar22._16_4_ * 3.0;
    auVar36._16_4_ = fVar169;
    fVar171 = fVar173 * auVar22._20_4_ * 3.0;
    auVar36._20_4_ = fVar171;
    fVar173 = fVar173 * auVar22._24_4_ * 3.0;
    auVar36._24_4_ = fVar173;
    auVar36._28_4_ = auVar116._28_4_;
    auVar232 = ZEXT1632(auVar126);
    local_b40 = vpermps_avx2(_DAT_01fb7720,auVar232);
    local_7c0 = vpermps_avx2(_DAT_01fb7720,auVar234);
    local_b60 = vpermps_avx2(_DAT_01fb7720,ZEXT1632(auVar151));
    local_2e0 = vsubps_avx(local_b40,ZEXT1632(auVar126));
    local_2c0 = vsubps_avx(local_b60,ZEXT1632(auVar151));
    fVar150 = local_2c0._0_4_;
    fVar166 = local_2c0._4_4_;
    auVar37._4_4_ = local_b00._4_4_ * fVar166;
    auVar37._0_4_ = (float)local_b00._0_4_ * fVar150;
    fVar170 = local_2c0._8_4_;
    auVar37._8_4_ = local_b00._8_4_ * fVar170;
    fVar174 = local_2c0._12_4_;
    auVar37._12_4_ = local_b00._12_4_ * fVar174;
    fVar288 = local_2c0._16_4_;
    auVar37._16_4_ = local_b00._16_4_ * fVar288;
    fVar279 = local_2c0._20_4_;
    auVar37._20_4_ = local_b00._20_4_ * fVar279;
    fVar17 = local_2c0._24_4_;
    auVar37._24_4_ = local_b00._24_4_ * fVar17;
    auVar37._28_4_ = local_b60._28_4_;
    auVar101 = vfmsub231ps_fma(auVar37,local_7e0,local_2e0);
    local_300 = vsubps_avx(local_7c0,auVar234);
    fVar164 = local_2e0._0_4_;
    fVar168 = local_2e0._4_4_;
    auVar38._4_4_ = local_8e0._4_4_ * fVar168;
    auVar38._0_4_ = (float)local_8e0._0_4_ * fVar164;
    fVar172 = local_2e0._8_4_;
    auVar38._8_4_ = local_8e0._8_4_ * fVar172;
    fVar175 = local_2e0._12_4_;
    auVar38._12_4_ = local_8e0._12_4_ * fVar175;
    fVar289 = local_2e0._16_4_;
    auVar38._16_4_ = local_8e0._16_4_ * fVar289;
    fVar280 = local_2e0._20_4_;
    auVar38._20_4_ = local_8e0._20_4_ * fVar280;
    fVar18 = local_2e0._24_4_;
    auVar38._24_4_ = local_8e0._24_4_ * fVar18;
    auVar38._28_4_ = local_7c0._28_4_;
    auVar133 = vfmsub231ps_fma(auVar38,local_b00,local_300);
    auVar101 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar133._12_4_ * auVar133._12_4_,
                                                  CONCAT48(auVar133._8_4_ * auVar133._8_4_,
                                                           CONCAT44(auVar133._4_4_ * auVar133._4_4_,
                                                                    auVar133._0_4_ * auVar133._0_4_)
                                                          ))),ZEXT1632(auVar101),ZEXT1632(auVar101))
    ;
    fVar257 = local_300._0_4_;
    auVar193._0_4_ = fVar257 * local_7e0._0_4_;
    fVar264 = local_300._4_4_;
    auVar193._4_4_ = fVar264 * local_7e0._4_4_;
    fVar265 = local_300._8_4_;
    auVar193._8_4_ = fVar265 * local_7e0._8_4_;
    fVar266 = local_300._12_4_;
    auVar193._12_4_ = fVar266 * local_7e0._12_4_;
    fVar267 = local_300._16_4_;
    auVar193._16_4_ = fVar267 * local_7e0._16_4_;
    fVar268 = local_300._20_4_;
    auVar193._20_4_ = fVar268 * local_7e0._20_4_;
    fVar269 = local_300._24_4_;
    auVar193._24_4_ = fVar269 * local_7e0._24_4_;
    auVar193._28_4_ = 0;
    auVar133 = vfmsub231ps_fma(auVar193,local_8e0,local_2c0);
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar101),ZEXT1632(auVar133),ZEXT1632(auVar133));
    auVar194._0_4_ = fVar150 * fVar150;
    auVar194._4_4_ = fVar166 * fVar166;
    auVar194._8_4_ = fVar170 * fVar170;
    auVar194._12_4_ = fVar174 * fVar174;
    auVar194._16_4_ = fVar288 * fVar288;
    auVar194._20_4_ = fVar279 * fVar279;
    auVar194._24_4_ = fVar17 * fVar17;
    auVar194._28_4_ = 0;
    auVar101 = vfmadd231ps_fma(auVar194,local_300,local_300);
    auVar155 = vfmadd231ps_fma(ZEXT1632(auVar101),local_2e0,local_2e0);
    auVar108 = vrcpps_avx(ZEXT1632(auVar155));
    auVar275._8_4_ = 0x3f800000;
    auVar275._0_8_ = 0x3f8000003f800000;
    auVar275._12_4_ = 0x3f800000;
    auVar275._16_4_ = 0x3f800000;
    auVar275._20_4_ = 0x3f800000;
    auVar275._24_4_ = 0x3f800000;
    auVar275._28_4_ = 0x3f800000;
    auVar101 = vfnmadd213ps_fma(auVar108,ZEXT1632(auVar155),auVar275);
    auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar108,auVar108);
    local_a60 = vpermps_avx2(_DAT_01fb7720,local_b00);
    auVar215 = vpermps_avx2(_DAT_01fb7720,local_7e0);
    auVar39._4_4_ = local_a60._4_4_ * fVar166;
    auVar39._0_4_ = local_a60._0_4_ * fVar150;
    auVar39._8_4_ = local_a60._8_4_ * fVar170;
    auVar39._12_4_ = local_a60._12_4_ * fVar174;
    auVar39._16_4_ = local_a60._16_4_ * fVar288;
    auVar39._20_4_ = local_a60._20_4_ * fVar279;
    auVar39._24_4_ = local_a60._24_4_ * fVar17;
    auVar39._28_4_ = auVar108._28_4_;
    auVar98 = vfmsub231ps_fma(auVar39,auVar215,local_2e0);
    local_a80 = vpermps_avx2(_DAT_01fb7720,local_8e0);
    auVar40._4_4_ = local_a80._4_4_ * fVar168;
    auVar40._0_4_ = local_a80._0_4_ * fVar164;
    auVar40._8_4_ = local_a80._8_4_ * fVar172;
    auVar40._12_4_ = local_a80._12_4_ * fVar175;
    auVar40._16_4_ = local_a80._16_4_ * fVar289;
    auVar40._20_4_ = local_a80._20_4_ * fVar280;
    auVar40._24_4_ = local_a80._24_4_ * fVar18;
    auVar40._28_4_ = 0;
    auVar229 = vfmsub231ps_fma(auVar40,local_a60,local_300);
    auVar98 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar229._12_4_ * auVar229._12_4_,
                                                 CONCAT48(auVar229._8_4_ * auVar229._8_4_,
                                                          CONCAT44(auVar229._4_4_ * auVar229._4_4_,
                                                                   auVar229._0_4_ * auVar229._0_4_))
                                                )),ZEXT1632(auVar98),ZEXT1632(auVar98));
    auVar224._0_4_ = fVar257 * auVar215._0_4_;
    auVar224._4_4_ = fVar264 * auVar215._4_4_;
    auVar224._8_4_ = fVar265 * auVar215._8_4_;
    auVar224._12_4_ = fVar266 * auVar215._12_4_;
    auVar224._16_4_ = fVar267 * auVar215._16_4_;
    auVar224._20_4_ = fVar268 * auVar215._20_4_;
    auVar224._24_4_ = fVar269 * auVar215._24_4_;
    auVar224._28_4_ = 0;
    auVar229 = vfmsub231ps_fma(auVar224,local_a80,local_2c0);
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),ZEXT1632(auVar229),ZEXT1632(auVar229));
    auVar108 = vmaxps_avx(ZEXT1632(CONCAT412(auVar133._12_4_ * auVar101._12_4_,
                                             CONCAT48(auVar133._8_4_ * auVar101._8_4_,
                                                      CONCAT44(auVar133._4_4_ * auVar101._4_4_,
                                                               auVar133._0_4_ * auVar101._0_4_)))),
                          ZEXT1632(CONCAT412(auVar98._12_4_ * auVar101._12_4_,
                                             CONCAT48(auVar98._8_4_ * auVar101._8_4_,
                                                      CONCAT44(auVar98._4_4_ * auVar101._4_4_,
                                                               auVar98._0_4_ * auVar101._0_4_)))));
    auVar212._0_4_ = auVar176._0_4_ + fVar149;
    auVar212._4_4_ = auVar176._4_4_ + fVar163;
    auVar212._8_4_ = auVar176._8_4_ + fVar165;
    auVar212._12_4_ = auVar176._12_4_ + fVar167;
    auVar212._16_4_ = fVar169 + 0.0;
    auVar212._20_4_ = fVar171 + 0.0;
    auVar212._24_4_ = fVar173 + 0.0;
    auVar212._28_4_ = auVar116._28_4_ + 0.0;
    local_840 = ZEXT1632(auVar176);
    auVar116 = vsubps_avx(local_840,auVar36);
    auVar140 = vpermps_avx2(_DAT_01fb7720,auVar116);
    local_640 = vpermps_avx2(_DAT_01fb7720,local_840);
    auVar116 = vmaxps_avx(local_840,auVar212);
    auVar21 = vmaxps_avx(auVar140,local_640);
    auVar116 = vmaxps_avx(auVar116,auVar21);
    auVar21 = vrsqrtps_avx(ZEXT1632(auVar155));
    fVar149 = auVar21._0_4_;
    fVar173 = auVar21._4_4_;
    fVar163 = auVar21._8_4_;
    fVar165 = auVar21._12_4_;
    fVar167 = auVar21._16_4_;
    fVar169 = auVar21._20_4_;
    fVar171 = auVar21._24_4_;
    uVar90 = auVar140._28_4_;
    auVar41._4_4_ = fVar173 * fVar173 * fVar173 * auVar155._4_4_ * -0.5;
    auVar41._0_4_ = fVar149 * fVar149 * fVar149 * auVar155._0_4_ * -0.5;
    auVar41._8_4_ = fVar163 * fVar163 * fVar163 * auVar155._8_4_ * -0.5;
    auVar41._12_4_ = fVar165 * fVar165 * fVar165 * auVar155._12_4_ * -0.5;
    auVar41._16_4_ = fVar167 * fVar167 * fVar167 * -0.0;
    auVar41._20_4_ = fVar169 * fVar169 * fVar169 * -0.0;
    auVar41._24_4_ = fVar171 * fVar171 * fVar171 * -0.0;
    auVar41._28_4_ = local_a80._28_4_;
    auVar109._8_4_ = 0x3fc00000;
    auVar109._0_8_ = 0x3fc000003fc00000;
    auVar109._12_4_ = 0x3fc00000;
    auVar109._16_4_ = 0x3fc00000;
    auVar109._20_4_ = 0x3fc00000;
    auVar109._24_4_ = 0x3fc00000;
    auVar109._28_4_ = 0x3fc00000;
    auVar101 = vfmadd231ps_fma(auVar41,auVar109,auVar21);
    auVar256 = ZEXT1664(auVar101);
    fVar149 = auVar101._0_4_;
    fVar173 = auVar101._4_4_;
    auVar42._4_4_ = fVar264 * fVar173;
    auVar42._0_4_ = fVar257 * fVar149;
    fVar163 = auVar101._8_4_;
    auVar42._8_4_ = fVar265 * fVar163;
    fVar165 = auVar101._12_4_;
    auVar42._12_4_ = fVar266 * fVar165;
    auVar42._16_4_ = fVar267 * 0.0;
    auVar42._20_4_ = fVar268 * 0.0;
    auVar42._24_4_ = fVar269 * 0.0;
    auVar42._28_4_ = 0;
    auVar43._4_4_ = (float)local_9c0._4_4_ * fVar173 * fVar166;
    auVar43._0_4_ = (float)local_9c0._0_4_ * fVar149 * fVar150;
    auVar43._8_4_ = fStack_9b8 * fVar163 * fVar170;
    auVar43._12_4_ = fStack_9b4 * fVar165 * fVar174;
    auVar43._16_4_ = fStack_9b0 * fVar288 * 0.0;
    auVar43._20_4_ = fStack_9ac * fVar279 * 0.0;
    auVar43._24_4_ = fStack_9a8 * fVar17 * 0.0;
    auVar43._28_4_ = local_a60._28_4_;
    auVar133 = vfmadd231ps_fma(auVar43,auVar42,_local_9a0);
    local_6a0 = ZEXT1632(auVar151);
    auVar21 = vsubps_avx(ZEXT832(0) << 0x20,local_6a0);
    fVar167 = auVar21._0_4_;
    fVar169 = auVar21._4_4_;
    auVar44._4_4_ = fVar169 * fVar173 * fVar166;
    auVar44._0_4_ = fVar167 * fVar149 * fVar150;
    fVar171 = auVar21._8_4_;
    auVar44._8_4_ = fVar171 * fVar163 * fVar170;
    fVar257 = auVar21._12_4_;
    auVar44._12_4_ = fVar257 * fVar165 * fVar174;
    fVar264 = auVar21._16_4_;
    auVar44._16_4_ = fVar264 * fVar288 * 0.0;
    fVar265 = auVar21._20_4_;
    auVar44._20_4_ = fVar265 * fVar279 * 0.0;
    fVar266 = auVar21._24_4_;
    auVar44._24_4_ = fVar266 * fVar17 * 0.0;
    auVar44._28_4_ = local_300._28_4_;
    auVar21 = vsubps_avx(ZEXT832(0) << 0x20,auVar234);
    auVar155 = vfmadd231ps_fma(auVar44,auVar21,auVar42);
    auVar45._4_4_ = fVar173 * fVar168;
    auVar45._0_4_ = fVar149 * fVar164;
    auVar45._8_4_ = fVar163 * fVar172;
    auVar45._12_4_ = fVar165 * fVar175;
    auVar45._16_4_ = fVar289 * 0.0;
    auVar45._20_4_ = fVar280 * 0.0;
    auVar45._24_4_ = fVar18 * 0.0;
    auVar45._28_4_ = uVar90;
    auVar133 = vfmadd231ps_fma(ZEXT1632(auVar133),auVar45,_local_6c0);
    auVar195 = ZEXT832(0) << 0x20;
    auVar22 = vsubps_avx(auVar195,auVar232);
    auVar155 = vfmadd231ps_fma(ZEXT1632(auVar155),auVar22,auVar45);
    local_660 = vsqrtps_avx(auVar108);
    auVar46._4_4_ = (float)local_9c0._4_4_ * fVar169;
    auVar46._0_4_ = (float)local_9c0._0_4_ * fVar167;
    auVar46._8_4_ = fStack_9b8 * fVar171;
    auVar46._12_4_ = fStack_9b4 * fVar257;
    auVar46._16_4_ = fStack_9b0 * fVar264;
    auVar46._20_4_ = fStack_9ac * fVar265;
    auVar46._24_4_ = fStack_9a8 * fVar266;
    auVar46._28_4_ = auVar108._28_4_;
    auVar98 = vfmadd231ps_fma(auVar46,_local_9a0,auVar21);
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),_local_6c0,auVar22);
    fVar150 = auVar155._0_4_;
    fVar288 = auVar133._0_4_;
    fVar164 = auVar155._4_4_;
    fVar289 = auVar133._4_4_;
    fVar166 = auVar155._8_4_;
    fVar279 = auVar133._8_4_;
    fVar168 = auVar155._12_4_;
    fVar280 = auVar133._12_4_;
    auVar47._28_4_ = uVar90;
    auVar47._0_28_ =
         ZEXT1628(CONCAT412(fVar280 * fVar168,
                            CONCAT48(fVar279 * fVar166,CONCAT44(fVar289 * fVar164,fVar288 * fVar150)
                                    )));
    auVar108 = vsubps_avx(ZEXT1632(auVar98),auVar47);
    auVar48._4_4_ = fVar169 * fVar169;
    auVar48._0_4_ = fVar167 * fVar167;
    auVar48._8_4_ = fVar171 * fVar171;
    auVar48._12_4_ = fVar257 * fVar257;
    auVar48._16_4_ = fVar264 * fVar264;
    auVar48._20_4_ = fVar265 * fVar265;
    auVar48._24_4_ = fVar266 * fVar266;
    auVar48._28_4_ = uVar90;
    auVar98 = vfmadd231ps_fma(auVar48,auVar21,auVar21);
    auVar98 = vfmadd231ps_fma(ZEXT1632(auVar98),auVar22,auVar22);
    auVar49._28_4_ = uStack_9a4;
    auVar49._0_28_ =
         ZEXT1628(CONCAT412(fVar168 * fVar168,
                            CONCAT48(fVar166 * fVar166,CONCAT44(fVar164 * fVar164,fVar150 * fVar150)
                                    )));
    auVar15 = vsubps_avx(ZEXT1632(auVar98),auVar49);
    fVar175 = local_660._28_4_ + auVar116._28_4_;
    fVar150 = (local_660._0_4_ + auVar116._0_4_) * 1.0000002;
    fVar164 = (local_660._4_4_ + auVar116._4_4_) * 1.0000002;
    fVar166 = (local_660._8_4_ + auVar116._8_4_) * 1.0000002;
    fVar168 = (local_660._12_4_ + auVar116._12_4_) * 1.0000002;
    fVar170 = (local_660._16_4_ + auVar116._16_4_) * 1.0000002;
    fVar172 = (local_660._20_4_ + auVar116._20_4_) * 1.0000002;
    fVar174 = (local_660._24_4_ + auVar116._24_4_) * 1.0000002;
    auVar50._4_4_ = fVar164 * fVar164;
    auVar50._0_4_ = fVar150 * fVar150;
    auVar50._8_4_ = fVar166 * fVar166;
    auVar50._12_4_ = fVar168 * fVar168;
    auVar50._16_4_ = fVar170 * fVar170;
    auVar50._20_4_ = fVar172 * fVar172;
    auVar50._24_4_ = fVar174 * fVar174;
    auVar50._28_4_ = fVar175;
    fVar150 = auVar108._0_4_ + auVar108._0_4_;
    fVar164 = auVar108._4_4_ + auVar108._4_4_;
    local_320._0_8_ = CONCAT44(fVar164,fVar150);
    local_320._8_4_ = auVar108._8_4_ + auVar108._8_4_;
    local_320._12_4_ = auVar108._12_4_ + auVar108._12_4_;
    local_320._16_4_ = auVar108._16_4_ + auVar108._16_4_;
    local_320._20_4_ = auVar108._20_4_ + auVar108._20_4_;
    local_320._24_4_ = auVar108._24_4_ + auVar108._24_4_;
    local_320._28_4_ = auVar108._28_4_ + auVar108._28_4_;
    auVar116 = vsubps_avx(auVar15,auVar50);
    local_a00 = ZEXT1632(auVar133);
    auVar51._28_4_ = auVar15._28_4_;
    auVar51._0_28_ =
         ZEXT1628(CONCAT412(fVar280 * fVar280,
                            CONCAT48(fVar279 * fVar279,CONCAT44(fVar289 * fVar289,fVar288 * fVar288)
                                    )));
    auVar196 = vsubps_avx(local_280,auVar51);
    auVar52._4_4_ = fVar164 * fVar164;
    auVar52._0_4_ = fVar150 * fVar150;
    auVar52._8_4_ = local_320._8_4_ * local_320._8_4_;
    auVar52._12_4_ = local_320._12_4_ * local_320._12_4_;
    auVar52._16_4_ = local_320._16_4_ * local_320._16_4_;
    auVar52._20_4_ = local_320._20_4_ * local_320._20_4_;
    auVar52._24_4_ = local_320._24_4_ * local_320._24_4_;
    auVar52._28_4_ = local_660._28_4_;
    fVar166 = auVar196._0_4_;
    local_680._0_4_ = fVar166 * 4.0;
    fVar168 = auVar196._4_4_;
    local_680._4_4_ = fVar168 * 4.0;
    fVar170 = auVar196._8_4_;
    fStack_678 = fVar170 * 4.0;
    fVar172 = auVar196._12_4_;
    fStack_674 = fVar172 * 4.0;
    fVar174 = auVar196._16_4_;
    fStack_670 = fVar174 * 4.0;
    fVar288 = auVar196._20_4_;
    fStack_66c = fVar288 * 4.0;
    fVar289 = auVar196._24_4_;
    fStack_668 = fVar289 * 4.0;
    uStack_664 = 0x40800000;
    auVar53._4_4_ = auVar116._4_4_ * (float)local_680._4_4_;
    auVar53._0_4_ = auVar116._0_4_ * (float)local_680._0_4_;
    auVar53._8_4_ = auVar116._8_4_ * fStack_678;
    auVar53._12_4_ = auVar116._12_4_ * fStack_674;
    auVar53._16_4_ = auVar116._16_4_ * fStack_670;
    auVar53._20_4_ = auVar116._20_4_ * fStack_66c;
    auVar53._24_4_ = auVar116._24_4_ * fStack_668;
    auVar53._28_4_ = fVar175;
    auVar20 = vsubps_avx(auVar52,auVar53);
    auVar108 = vcmpps_avx(auVar20,auVar195,5);
    local_420 = vandps_avx(auVar51,local_6e0);
    local_340._0_4_ = fVar166 + fVar166;
    local_340._4_4_ = fVar168 + fVar168;
    local_340._8_4_ = fVar170 + fVar170;
    local_340._12_4_ = fVar172 + fVar172;
    local_340._16_4_ = fVar174 + fVar174;
    local_340._20_4_ = fVar288 + fVar288;
    local_340._24_4_ = fVar289 + fVar289;
    local_340._28_4_ = auVar196._28_4_ + auVar196._28_4_;
    local_440 = vandps_avx(auVar196,local_6e0);
    local_aa0 = -0.0;
    fStack_a9c = -0.0;
    fStack_a98 = -0.0;
    fStack_a94 = -0.0;
    uStack_a90 = 0x80000000;
    uStack_a8c = 0x80000000;
    uStack_a88 = 0x80000000;
    uStack_a84 = 0x80000000;
    local_460 = ZEXT1632(auVar155);
    if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0x7f,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar108 >> 0xbf,0) == '\0') &&
        (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar108[0x1f])
    {
      auVar276._8_4_ = 0x7f800000;
      auVar276._0_8_ = 0x7f8000007f800000;
      auVar276._12_4_ = 0x7f800000;
      auVar276._16_4_ = 0x7f800000;
      auVar276._20_4_ = 0x7f800000;
      auVar276._24_4_ = 0x7f800000;
      auVar276._28_4_ = 0x7f800000;
      auVar278 = ZEXT3264(CONCAT428(0xff800000,
                                    CONCAT424(0xff800000,
                                              CONCAT420(0xff800000,
                                                        CONCAT416(0xff800000,
                                                                  CONCAT412(0xff800000,
                                                                            CONCAT48(0xff800000,
                                                                                                                                                                          
                                                  0xff800000ff800000)))))));
    }
    else {
      auVar19 = vsqrtps_avx(auVar20);
      auVar196 = vrcpps_avx(local_340);
      auVar20 = vcmpps_avx(auVar20,auVar195,5);
      auVar240._8_4_ = 0x3f800000;
      auVar240._0_8_ = 0x3f8000003f800000;
      auVar240._12_4_ = 0x3f800000;
      auVar240._16_4_ = 0x3f800000;
      auVar240._20_4_ = 0x3f800000;
      auVar240._24_4_ = 0x3f800000;
      auVar240._28_4_ = 0x3f800000;
      auVar133 = vfnmadd213ps_fma(auVar196,local_340,auVar240);
      auVar133 = vfmadd132ps_fma(ZEXT1632(auVar133),auVar196,auVar196);
      auVar110._0_8_ = local_320._0_8_ ^ 0x8000000080000000;
      auVar110._8_4_ = -local_320._8_4_;
      auVar110._12_4_ = -local_320._12_4_;
      auVar110._16_4_ = -local_320._16_4_;
      auVar110._20_4_ = -local_320._20_4_;
      auVar110._24_4_ = -local_320._24_4_;
      auVar110._28_4_ = -local_320._28_4_;
      auVar196 = vsubps_avx(auVar110,auVar19);
      auVar54._4_4_ = auVar196._4_4_ * auVar133._4_4_;
      auVar54._0_4_ = auVar196._0_4_ * auVar133._0_4_;
      auVar54._8_4_ = auVar196._8_4_ * auVar133._8_4_;
      auVar54._12_4_ = auVar196._12_4_ * auVar133._12_4_;
      auVar54._16_4_ = auVar196._16_4_ * 0.0;
      auVar54._20_4_ = auVar196._20_4_ * 0.0;
      auVar54._24_4_ = auVar196._24_4_ * 0.0;
      auVar54._28_4_ = auVar196._28_4_;
      auVar196 = vsubps_avx(auVar19,local_320);
      auVar225._0_4_ = auVar196._0_4_ * auVar133._0_4_;
      auVar225._4_4_ = auVar196._4_4_ * auVar133._4_4_;
      auVar225._8_4_ = auVar196._8_4_ * auVar133._8_4_;
      auVar225._12_4_ = auVar196._12_4_ * auVar133._12_4_;
      auVar225._16_4_ = auVar196._16_4_ * 0.0;
      auVar225._20_4_ = auVar196._20_4_ * 0.0;
      auVar225._24_4_ = auVar196._24_4_ * 0.0;
      auVar225._28_4_ = 0;
      auVar133 = vfmadd213ps_fma(local_a00,auVar54,local_460);
      local_400 = fVar149 * auVar133._0_4_;
      fStack_3fc = fVar173 * auVar133._4_4_;
      fStack_3f8 = fVar163 * auVar133._8_4_;
      fStack_3f4 = fVar165 * auVar133._12_4_;
      uStack_3f0 = 0;
      uStack_3ec = 0;
      uStack_3e8 = 0;
      fStack_3e4 = local_340._28_4_;
      auVar133 = vfmadd213ps_fma(local_a00,auVar225,local_460);
      local_3e0 = fVar149 * auVar133._0_4_;
      fStack_3dc = fVar173 * auVar133._4_4_;
      fStack_3d8 = fVar163 * auVar133._8_4_;
      fStack_3d4 = fVar165 * auVar133._12_4_;
      uStack_3d0 = 0;
      uStack_3cc = 0;
      uStack_3c8 = 0;
      fStack_3c4 = local_340._28_4_;
      auVar241._8_4_ = 0x7f800000;
      auVar241._0_8_ = 0x7f8000007f800000;
      auVar241._12_4_ = 0x7f800000;
      auVar241._16_4_ = 0x7f800000;
      auVar241._20_4_ = 0x7f800000;
      auVar241._24_4_ = 0x7f800000;
      auVar241._28_4_ = 0x7f800000;
      auVar276 = vblendvps_avx(auVar241,auVar54,auVar20);
      auVar111._8_4_ = 0xff800000;
      auVar111._0_8_ = 0xff800000ff800000;
      auVar111._12_4_ = 0xff800000;
      auVar111._16_4_ = 0xff800000;
      auVar111._20_4_ = 0xff800000;
      auVar111._24_4_ = 0xff800000;
      auVar111._28_4_ = 0xff800000;
      auVar196 = vblendvps_avx(auVar111,auVar225,auVar20);
      auVar278 = ZEXT3264(auVar196);
      auVar195 = vmaxps_avx(local_600,local_420);
      auVar55._4_4_ = auVar195._4_4_ * 1.9073486e-06;
      auVar55._0_4_ = auVar195._0_4_ * 1.9073486e-06;
      auVar55._8_4_ = auVar195._8_4_ * 1.9073486e-06;
      auVar55._12_4_ = auVar195._12_4_ * 1.9073486e-06;
      auVar55._16_4_ = auVar195._16_4_ * 1.9073486e-06;
      auVar55._20_4_ = auVar195._20_4_ * 1.9073486e-06;
      auVar55._24_4_ = auVar195._24_4_ * 1.9073486e-06;
      auVar55._28_4_ = auVar195._28_4_;
      auVar195 = vcmpps_avx(local_440,auVar55,1);
      auVar19 = auVar20 & auVar195;
      if ((((((((auVar19 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar19 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar19 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar19 >> 0x7f,0) == '\0') &&
            (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar19 >> 0xbf,0) == '\0') &&
          (auVar19 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar19[0x1f])
      {
        auVar256 = ZEXT3264(ZEXT1632(auVar101));
      }
      else {
        auVar108 = vandps_avx(auVar195,auVar20);
        auVar195 = vcmpps_avx(auVar116,_DAT_01f7b000,2);
        auVar262._8_4_ = 0xff800000;
        auVar262._0_8_ = 0xff800000ff800000;
        auVar262._12_4_ = 0xff800000;
        auVar262._16_4_ = 0xff800000;
        auVar262._20_4_ = 0xff800000;
        auVar262._24_4_ = 0xff800000;
        auVar262._28_4_ = 0xff800000;
        auVar244._8_4_ = 0x7f800000;
        auVar244._0_8_ = 0x7f8000007f800000;
        auVar244._12_4_ = 0x7f800000;
        auVar244._16_4_ = 0x7f800000;
        auVar244._20_4_ = 0x7f800000;
        auVar244._24_4_ = 0x7f800000;
        auVar244._28_4_ = 0x7f800000;
        auVar116 = vblendvps_avx(auVar244,auVar262,auVar195);
        auVar133 = vpackssdw_avx(auVar108._0_16_,auVar108._16_16_);
        auVar19 = vpmovsxwd_avx2(auVar133);
        auVar276 = vblendvps_avx(auVar276,auVar116,auVar19);
        auVar116 = vblendvps_avx(auVar262,auVar244,auVar195);
        auVar116 = vblendvps_avx(auVar196,auVar116,auVar19);
        auVar278 = ZEXT3264(auVar116);
        auVar121._0_8_ = auVar108._0_8_ ^ 0xffffffffffffffff;
        auVar121._8_4_ = auVar108._8_4_ ^ 0xffffffff;
        auVar121._12_4_ = auVar108._12_4_ ^ 0xffffffff;
        auVar121._16_4_ = auVar108._16_4_ ^ 0xffffffff;
        auVar121._20_4_ = auVar108._20_4_ ^ 0xffffffff;
        auVar121._24_4_ = auVar108._24_4_ ^ 0xffffffff;
        auVar121._28_4_ = auVar108._28_4_ ^ 0xffffffff;
        auVar108 = vorps_avx(auVar195,auVar121);
        auVar108 = vandps_avx(auVar20,auVar108);
        auVar256 = ZEXT3264(ZEXT1632(auVar101));
      }
    }
    auVar116 = local_560 & auVar108;
    auVar263 = ZEXT3264(local_a00);
    if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar116 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar116 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar116 >> 0x7f,0) == '\0') &&
          (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar116 >> 0xbf,0) == '\0') &&
        (auVar116 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar116[0x1f])
    {
LAB_014253e8:
      auVar284 = ZEXT3264(local_a20);
      auVar278 = ZEXT3264(local_a40);
      fVar150 = (float)local_900._0_4_;
      fVar164 = (float)local_900._4_4_;
      fVar149 = fStack_8f8;
      fVar166 = fStack_8f4;
      fVar168 = fStack_8f0;
      fVar173 = fStack_8ec;
      fVar170 = fStack_8e8;
      fVar172 = fStack_8e4;
    }
    else {
      auVar253 = ZEXT464((uint)*(float *)(ray + k * 4 + 0x80));
      fVar149 = *(float *)(ray + k * 4 + 0x80) - (float)local_970._0_4_;
      auVar112._4_4_ = fVar149;
      auVar112._0_4_ = fVar149;
      auVar112._8_4_ = fVar149;
      auVar112._12_4_ = fVar149;
      auVar112._16_4_ = fVar149;
      auVar112._20_4_ = fVar149;
      auVar112._24_4_ = fVar149;
      auVar112._28_4_ = fVar149;
      auVar20 = vminps_avx(auVar112,auVar278._0_32_);
      auVar284._0_4_ = fVar167 * local_7e0._0_4_;
      auVar284._4_4_ = fVar169 * local_7e0._4_4_;
      auVar284._8_4_ = fVar171 * local_7e0._8_4_;
      auVar284._12_4_ = fVar257 * local_7e0._12_4_;
      auVar284._16_4_ = fVar264 * local_7e0._16_4_;
      auVar284._20_4_ = fVar265 * local_7e0._20_4_;
      auVar284._28_36_ = auVar278._28_36_;
      auVar284._24_4_ = fVar266 * local_7e0._24_4_;
      auVar101 = vfmadd213ps_fma(auVar21,local_8e0,auVar284._0_32_);
      auVar80._4_4_ = fStack_39c;
      auVar80._0_4_ = local_3a0;
      auVar80._8_4_ = fStack_398;
      auVar80._12_4_ = fStack_394;
      auVar80._16_4_ = fStack_390;
      auVar80._20_4_ = fStack_38c;
      auVar80._24_4_ = fStack_388;
      auVar80._28_4_ = fStack_384;
      auVar196 = vmaxps_avx(auVar80,auVar276);
      auVar133 = vfmadd213ps_fma(auVar22,local_b00,ZEXT1632(auVar101));
      auVar213._0_4_ = (float)local_9c0._0_4_ * local_7e0._0_4_;
      auVar213._4_4_ = (float)local_9c0._4_4_ * local_7e0._4_4_;
      auVar213._8_4_ = fStack_9b8 * local_7e0._8_4_;
      auVar213._12_4_ = fStack_9b4 * local_7e0._12_4_;
      auVar213._16_4_ = fStack_9b0 * local_7e0._16_4_;
      auVar213._20_4_ = fStack_9ac * local_7e0._20_4_;
      auVar213._24_4_ = fStack_9a8 * local_7e0._24_4_;
      auVar213._28_4_ = 0;
      auVar101 = vfmadd231ps_fma(auVar213,_local_9a0,local_8e0);
      auVar155 = vfmadd231ps_fma(ZEXT1632(auVar101),_local_6c0,local_b00);
      auVar116 = vandps_avx(local_6e0,ZEXT1632(auVar155));
      auVar277._8_4_ = 0x219392ef;
      auVar277._0_8_ = 0x219392ef219392ef;
      auVar277._12_4_ = 0x219392ef;
      auVar277._16_4_ = 0x219392ef;
      auVar277._20_4_ = 0x219392ef;
      auVar277._24_4_ = 0x219392ef;
      auVar277._28_4_ = 0x219392ef;
      auVar21 = vcmpps_avx(auVar116,auVar277,1);
      auVar116 = vrcpps_avx(ZEXT1632(auVar155));
      auVar281._8_4_ = 0x3f800000;
      auVar281._0_8_ = 0x3f8000003f800000;
      auVar281._12_4_ = 0x3f800000;
      auVar281._16_4_ = 0x3f800000;
      auVar281._20_4_ = 0x3f800000;
      auVar281._24_4_ = 0x3f800000;
      auVar281._28_4_ = 0x3f800000;
      auVar195 = ZEXT1632(auVar155);
      auVar101 = vfnmadd213ps_fma(auVar116,auVar195,auVar281);
      auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar116,auVar116);
      auVar282._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
      auVar282._8_4_ = auVar155._8_4_ ^ 0x80000000;
      auVar282._12_4_ = auVar155._12_4_ ^ 0x80000000;
      auVar282._16_4_ = 0x80000000;
      auVar282._20_4_ = 0x80000000;
      auVar282._24_4_ = 0x80000000;
      auVar282._28_4_ = 0x80000000;
      auVar56._4_4_ = auVar101._4_4_ * -auVar133._4_4_;
      auVar56._0_4_ = auVar101._0_4_ * -auVar133._0_4_;
      auVar56._8_4_ = auVar101._8_4_ * -auVar133._8_4_;
      auVar56._12_4_ = auVar101._12_4_ * -auVar133._12_4_;
      auVar56._16_4_ = 0x80000000;
      auVar56._20_4_ = 0x80000000;
      auVar56._24_4_ = 0x80000000;
      auVar56._28_4_ = 0x80000000;
      auVar116 = vcmpps_avx(auVar195,auVar282,1);
      auVar116 = vorps_avx(auVar21,auVar116);
      auVar242._8_4_ = 0xff800000;
      auVar242._0_8_ = 0xff800000ff800000;
      auVar242._12_4_ = 0xff800000;
      auVar242._16_4_ = 0xff800000;
      auVar242._20_4_ = 0xff800000;
      auVar242._24_4_ = 0xff800000;
      auVar242._28_4_ = 0xff800000;
      auVar116 = vblendvps_avx(auVar56,auVar242,auVar116);
      auVar22 = vmaxps_avx(auVar196,auVar116);
      auVar116 = vcmpps_avx(auVar195,auVar282,6);
      auVar116 = vorps_avx(auVar21,auVar116);
      auVar283._8_4_ = 0x7f800000;
      auVar283._0_8_ = 0x7f8000007f800000;
      auVar283._12_4_ = 0x7f800000;
      auVar283._16_4_ = 0x7f800000;
      auVar283._20_4_ = 0x7f800000;
      auVar283._24_4_ = 0x7f800000;
      auVar283._28_4_ = 0x7f800000;
      auVar116 = vblendvps_avx(auVar56,auVar283,auVar116);
      auVar196 = vminps_avx(auVar20,auVar116);
      uStack_be4 = auVar215._28_4_;
      fVar149 = -auVar215._0_4_;
      fVar166 = -auVar215._4_4_;
      fVar168 = -auVar215._8_4_;
      fVar173 = -auVar215._12_4_;
      fVar170 = -auVar215._16_4_;
      fVar172 = -auVar215._20_4_;
      fVar163 = -auVar215._24_4_;
      auVar214._0_8_ = local_a80._0_8_ ^ 0x8000000080000000;
      auVar214._8_4_ = -local_a80._8_4_;
      auVar214._12_4_ = -local_a80._12_4_;
      auVar214._16_4_ = -local_a80._16_4_;
      auVar214._20_4_ = -local_a80._20_4_;
      auVar214._24_4_ = -local_a80._24_4_;
      auVar214._28_4_ = local_a80._28_4_ ^ 0x80000000;
      auVar116 = vsubps_avx(ZEXT832(0) << 0x20,local_7c0);
      auVar21 = vsubps_avx(ZEXT832(0) << 0x20,local_b60);
      auVar57._4_4_ = auVar21._4_4_ * fVar166;
      auVar57._0_4_ = auVar21._0_4_ * fVar149;
      auVar57._8_4_ = auVar21._8_4_ * fVar168;
      auVar57._12_4_ = auVar21._12_4_ * fVar173;
      auVar57._16_4_ = auVar21._16_4_ * fVar170;
      auVar57._20_4_ = auVar21._20_4_ * fVar172;
      auVar57._24_4_ = auVar21._24_4_ * fVar163;
      auVar57._28_4_ = auVar21._28_4_;
      auVar101 = vfmadd231ps_fma(auVar57,auVar214,auVar116);
      auVar226._0_8_ = local_a60._0_8_ ^ 0x8000000080000000;
      auVar226._8_4_ = -local_a60._8_4_;
      auVar226._12_4_ = -local_a60._12_4_;
      auVar226._16_4_ = -local_a60._16_4_;
      auVar226._20_4_ = -local_a60._20_4_;
      auVar226._24_4_ = -local_a60._24_4_;
      auVar226._28_4_ = local_a60._28_4_ ^ 0x80000000;
      auVar116 = vsubps_avx(ZEXT832(0) << 0x20,local_b40);
      auVar133 = vfmadd231ps_fma(ZEXT1632(auVar101),auVar226,auVar116);
      auVar58._4_4_ = fVar166 * (float)local_9c0._4_4_;
      auVar58._0_4_ = fVar149 * (float)local_9c0._0_4_;
      auVar58._8_4_ = fVar168 * fStack_9b8;
      auVar58._12_4_ = fVar173 * fStack_9b4;
      auVar58._16_4_ = fVar170 * fStack_9b0;
      auVar58._20_4_ = fVar172 * fStack_9ac;
      auVar58._24_4_ = fVar163 * fStack_9a8;
      auVar58._28_4_ = uStack_be4 ^ 0x80000000;
      auVar101 = vfmadd231ps_fma(auVar58,auVar214,_local_9a0);
      auVar155 = vfmadd231ps_fma(ZEXT1632(auVar101),_local_6c0,auVar226);
      auVar116 = vandps_avx(local_6e0,ZEXT1632(auVar155));
      auVar215 = vrcpps_avx(ZEXT1632(auVar155));
      auVar21 = vcmpps_avx(auVar116,auVar277,1);
      auVar113._8_4_ = 0x3f800000;
      auVar113._0_8_ = 0x3f8000003f800000;
      auVar113._12_4_ = 0x3f800000;
      auVar113._16_4_ = 0x3f800000;
      auVar113._20_4_ = 0x3f800000;
      auVar113._24_4_ = 0x3f800000;
      auVar113._28_4_ = 0x3f800000;
      auVar195 = ZEXT1632(auVar155);
      auVar101 = vfnmadd213ps_fma(auVar215,auVar195,auVar113);
      auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar215,auVar215);
      auVar227._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
      auVar227._8_4_ = auVar155._8_4_ ^ 0x80000000;
      auVar227._12_4_ = auVar155._12_4_ ^ 0x80000000;
      auVar227._16_4_ = 0x80000000;
      auVar227._20_4_ = 0x80000000;
      auVar227._24_4_ = 0x80000000;
      auVar227._28_4_ = 0x80000000;
      auVar59._4_4_ = auVar101._4_4_ * -auVar133._4_4_;
      auVar59._0_4_ = auVar101._0_4_ * -auVar133._0_4_;
      auVar59._8_4_ = auVar101._8_4_ * -auVar133._8_4_;
      auVar59._12_4_ = auVar101._12_4_ * -auVar133._12_4_;
      auVar59._16_4_ = 0x80000000;
      auVar59._20_4_ = 0x80000000;
      auVar59._24_4_ = 0x80000000;
      auVar59._28_4_ = 0x80000000;
      auVar116 = vcmpps_avx(auVar195,auVar227,1);
      auVar116 = vorps_avx(auVar116,auVar21);
      auVar114._8_4_ = 0xff800000;
      auVar114._0_8_ = 0xff800000ff800000;
      auVar114._12_4_ = 0xff800000;
      auVar114._16_4_ = 0xff800000;
      auVar114._20_4_ = 0xff800000;
      auVar114._24_4_ = 0xff800000;
      auVar114._28_4_ = 0xff800000;
      auVar116 = vblendvps_avx(auVar59,auVar114,auVar116);
      local_920 = vmaxps_avx(auVar22,auVar116);
      auVar116 = vcmpps_avx(auVar195,auVar227,6);
      auVar116 = vorps_avx(auVar21,auVar116);
      auVar116 = vblendvps_avx(auVar59,auVar283,auVar116);
      auVar108 = vandps_avx(auVar108,local_560);
      local_480 = vminps_avx(auVar196,auVar116);
      auVar116 = vcmpps_avx(local_920,local_480,2);
      auVar21 = auVar108 & auVar116;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar21 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar21 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar21 >> 0x7f,0) == '\0') &&
            (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar21 >> 0xbf,0) == '\0') &&
          (auVar21 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar21[0x1f])
      goto LAB_014253e8;
      auVar78._4_4_ = fStack_3fc;
      auVar78._0_4_ = local_400;
      auVar78._8_4_ = fStack_3f8;
      auVar78._12_4_ = fStack_3f4;
      auVar78._16_4_ = uStack_3f0;
      auVar78._20_4_ = uStack_3ec;
      auVar78._24_4_ = uStack_3e8;
      auVar78._28_4_ = fStack_3e4;
      auVar233._8_4_ = 0x3f800000;
      auVar233._0_8_ = 0x3f8000003f800000;
      auVar233._12_4_ = 0x3f800000;
      auVar233._16_4_ = 0x3f800000;
      auVar233._20_4_ = 0x3f800000;
      auVar233._24_4_ = 0x3f800000;
      auVar233._28_4_ = 0x3f800000;
      auVar21 = vminps_avx(auVar78,auVar233);
      auVar196 = SUB6432(ZEXT864(0),0) << 0x20;
      auVar21 = vmaxps_avx(auVar21,ZEXT832(0) << 0x20);
      auVar79._4_4_ = fStack_3dc;
      auVar79._0_4_ = local_3e0;
      auVar79._8_4_ = fStack_3d8;
      auVar79._12_4_ = fStack_3d4;
      auVar79._16_4_ = uStack_3d0;
      auVar79._20_4_ = uStack_3cc;
      auVar79._24_4_ = uStack_3c8;
      auVar79._28_4_ = fStack_3c4;
      auVar22 = vminps_avx(auVar79,auVar233);
      auVar22 = vmaxps_avx(auVar22,ZEXT832(0) << 0x20);
      auVar60._4_4_ = (auVar21._4_4_ + 1.0) * 0.125;
      auVar60._0_4_ = (auVar21._0_4_ + 0.0) * 0.125;
      auVar60._8_4_ = (auVar21._8_4_ + 2.0) * 0.125;
      auVar60._12_4_ = (auVar21._12_4_ + 3.0) * 0.125;
      auVar60._16_4_ = (auVar21._16_4_ + 4.0) * 0.125;
      auVar60._20_4_ = (auVar21._20_4_ + 5.0) * 0.125;
      auVar60._24_4_ = (auVar21._24_4_ + 6.0) * 0.125;
      auVar60._28_4_ = auVar21._28_4_ + 7.0;
      auVar101 = vfmadd213ps_fma(auVar60,local_820,local_800);
      auVar61._4_4_ = (auVar22._4_4_ + 1.0) * 0.125;
      auVar61._0_4_ = (auVar22._0_4_ + 0.0) * 0.125;
      auVar61._8_4_ = (auVar22._8_4_ + 2.0) * 0.125;
      auVar61._12_4_ = (auVar22._12_4_ + 3.0) * 0.125;
      auVar61._16_4_ = (auVar22._16_4_ + 4.0) * 0.125;
      auVar61._20_4_ = (auVar22._20_4_ + 5.0) * 0.125;
      auVar61._24_4_ = (auVar22._24_4_ + 6.0) * 0.125;
      auVar61._28_4_ = auVar22._28_4_ + 7.0;
      auVar133 = vfmadd213ps_fma(auVar61,local_820,local_800);
      auVar21 = vminps_avx(local_840,auVar212);
      auVar22 = vminps_avx(auVar140,local_640);
      auVar21 = vminps_avx(auVar21,auVar22);
      auVar21 = vsubps_avx(auVar21,local_660);
      auVar108 = vandps_avx(auVar116,auVar108);
      local_1a0 = ZEXT1632(auVar101);
      local_1c0 = ZEXT1632(auVar133);
      auVar62._4_4_ = auVar21._4_4_ * 0.99999976;
      auVar62._0_4_ = auVar21._0_4_ * 0.99999976;
      auVar62._8_4_ = auVar21._8_4_ * 0.99999976;
      auVar62._12_4_ = auVar21._12_4_ * 0.99999976;
      auVar62._16_4_ = auVar21._16_4_ * 0.99999976;
      auVar62._20_4_ = auVar21._20_4_ * 0.99999976;
      auVar62._24_4_ = auVar21._24_4_ * 0.99999976;
      auVar62._28_4_ = 0x3f7ffffc;
      auVar116 = vmaxps_avx(ZEXT832(0) << 0x20,auVar62);
      auVar63._4_4_ = auVar116._4_4_ * auVar116._4_4_;
      auVar63._0_4_ = auVar116._0_4_ * auVar116._0_4_;
      auVar63._8_4_ = auVar116._8_4_ * auVar116._8_4_;
      auVar63._12_4_ = auVar116._12_4_ * auVar116._12_4_;
      auVar63._16_4_ = auVar116._16_4_ * auVar116._16_4_;
      auVar63._20_4_ = auVar116._20_4_ * auVar116._20_4_;
      auVar63._24_4_ = auVar116._24_4_ * auVar116._24_4_;
      auVar63._28_4_ = auVar116._28_4_;
      auVar21 = vsubps_avx(auVar15,auVar63);
      auVar64._4_4_ = auVar21._4_4_ * (float)local_680._4_4_;
      auVar64._0_4_ = auVar21._0_4_ * (float)local_680._0_4_;
      auVar64._8_4_ = auVar21._8_4_ * fStack_678;
      auVar64._12_4_ = auVar21._12_4_ * fStack_674;
      auVar64._16_4_ = auVar21._16_4_ * fStack_670;
      auVar64._20_4_ = auVar21._20_4_ * fStack_66c;
      auVar64._24_4_ = auVar21._24_4_ * fStack_668;
      auVar64._28_4_ = auVar116._28_4_;
      auVar22 = vsubps_avx(auVar52,auVar64);
      _local_b80 = vcmpps_avx(auVar22,ZEXT832(0) << 0x20,5);
      auVar116 = _local_b80;
      if ((((((((_local_b80 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (_local_b80 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (_local_b80 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(_local_b80 >> 0x7f,0) == '\0') &&
            (_local_b80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(_local_b80 >> 0xbf,0) == '\0') &&
          (_local_b80 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_b80[0x1f]) {
        auVar234 = SUB6432(ZEXT864(0),0) << 0x20;
        auVar274 = ZEXT828(0) << 0x20;
        auVar256 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar215 = SUB6432(ZEXT864(0),0) << 0x20;
        _local_c80 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar243._8_4_ = 0x7f800000;
        auVar243._0_8_ = 0x7f8000007f800000;
        auVar243._12_4_ = 0x7f800000;
        auVar243._16_4_ = 0x7f800000;
        auVar243._20_4_ = 0x7f800000;
        auVar243._24_4_ = 0x7f800000;
        auVar243._28_4_ = 0x7f800000;
        auVar261._8_4_ = 0xff800000;
        auVar261._0_8_ = 0xff800000ff800000;
        auVar261._12_4_ = 0xff800000;
        auVar261._16_4_ = 0xff800000;
        auVar261._20_4_ = 0xff800000;
        auVar261._24_4_ = 0xff800000;
        auVar261._28_4_ = 0xff800000;
        _local_b80 = auVar20;
      }
      else {
        auVar15 = vrcpps_avx(local_340);
        auVar216._8_4_ = 0x3f800000;
        auVar216._0_8_ = 0x3f8000003f800000;
        auVar216._12_4_ = 0x3f800000;
        auVar216._16_4_ = 0x3f800000;
        auVar216._20_4_ = 0x3f800000;
        auVar216._24_4_ = 0x3f800000;
        auVar216._28_4_ = 0x3f800000;
        auVar101 = vfnmadd213ps_fma(local_340,auVar15,auVar216);
        auVar196 = vsqrtps_avx(auVar22);
        auVar101 = vfmadd132ps_fma(ZEXT1632(auVar101),auVar15,auVar15);
        auVar197._0_8_ = CONCAT44(fVar164,fVar150) ^ 0x8000000080000000;
        auVar197._8_4_ = -local_320._8_4_;
        auVar197._12_4_ = -local_320._12_4_;
        auVar197._16_4_ = -local_320._16_4_;
        auVar197._20_4_ = -local_320._20_4_;
        auVar197._24_4_ = -local_320._24_4_;
        auVar197._28_4_ = -local_320._28_4_;
        auVar15 = vsubps_avx(auVar197,auVar196);
        auVar196 = vsubps_avx(auVar196,local_320);
        fVar150 = auVar15._0_4_ * auVar101._0_4_;
        fVar164 = auVar15._4_4_ * auVar101._4_4_;
        auVar65._4_4_ = fVar164;
        auVar65._0_4_ = fVar150;
        fVar149 = auVar15._8_4_ * auVar101._8_4_;
        auVar65._8_4_ = fVar149;
        fVar166 = auVar15._12_4_ * auVar101._12_4_;
        auVar65._12_4_ = fVar166;
        fVar168 = auVar15._16_4_ * 0.0;
        auVar65._16_4_ = fVar168;
        fVar173 = auVar15._20_4_ * 0.0;
        auVar65._20_4_ = fVar173;
        fVar170 = auVar15._24_4_ * 0.0;
        auVar65._24_4_ = fVar170;
        auVar65._28_4_ = local_320._28_4_;
        fVar172 = auVar196._0_4_ * auVar101._0_4_;
        fVar163 = auVar196._4_4_ * auVar101._4_4_;
        auVar66._4_4_ = fVar163;
        auVar66._0_4_ = fVar172;
        fVar174 = auVar196._8_4_ * auVar101._8_4_;
        auVar66._8_4_ = fVar174;
        fVar175 = auVar196._12_4_ * auVar101._12_4_;
        auVar66._12_4_ = fVar175;
        fVar165 = auVar196._16_4_ * 0.0;
        auVar66._16_4_ = fVar165;
        fVar288 = auVar196._20_4_ * 0.0;
        auVar66._20_4_ = fVar288;
        fVar289 = auVar196._24_4_ * 0.0;
        auVar66._24_4_ = fVar289;
        auVar66._28_4_ = 0x80000000;
        auVar101 = vfmadd213ps_fma(local_a00,auVar65,local_460);
        auVar133 = vfmadd213ps_fma(local_a00,auVar66,local_460);
        auVar198._0_4_ = auVar256._0_4_ * auVar101._0_4_;
        auVar198._4_4_ = auVar256._4_4_ * auVar101._4_4_;
        auVar198._8_4_ = auVar256._8_4_ * auVar101._8_4_;
        auVar198._12_4_ = auVar256._12_4_ * auVar101._12_4_;
        auVar198._16_4_ = auVar256._16_4_ * 0.0;
        auVar198._20_4_ = auVar256._20_4_ * 0.0;
        auVar198._24_4_ = auVar256._24_4_ * 0.0;
        auVar198._28_4_ = 0;
        auVar67._4_4_ = auVar256._4_4_ * auVar133._4_4_;
        auVar67._0_4_ = auVar256._0_4_ * auVar133._0_4_;
        auVar67._8_4_ = auVar256._8_4_ * auVar133._8_4_;
        auVar67._12_4_ = auVar256._12_4_ * auVar133._12_4_;
        auVar67._16_4_ = auVar256._16_4_ * 0.0;
        auVar67._20_4_ = auVar256._20_4_ * 0.0;
        auVar67._24_4_ = auVar256._24_4_ * 0.0;
        auVar67._28_4_ = 0;
        auVar101 = vfmadd213ps_fma(local_2e0,auVar198,auVar232);
        auVar133 = vfmadd213ps_fma(local_2e0,auVar67,auVar232);
        auVar155 = vfmadd213ps_fma(local_300,auVar198,auVar234);
        auVar98 = vfmadd213ps_fma(local_300,auVar67,auVar234);
        auVar229 = vfmadd213ps_fma(auVar198,local_2c0,local_6a0);
        auVar258 = vfmadd213ps_fma(local_2c0,auVar67,local_6a0);
        auVar68._4_4_ = (float)local_6c0._4_4_ * fVar164;
        auVar68._0_4_ = (float)local_6c0._0_4_ * fVar150;
        auVar68._8_4_ = fStack_6b8 * fVar149;
        auVar68._12_4_ = fStack_6b4 * fVar166;
        auVar68._16_4_ = fStack_6b0 * fVar168;
        auVar68._20_4_ = fStack_6ac * fVar173;
        auVar68._24_4_ = fStack_6a8 * fVar170;
        auVar68._28_4_ = 0;
        auVar20 = vsubps_avx(auVar68,ZEXT1632(auVar101));
        auVar235._0_4_ = (float)local_9a0._0_4_ * fVar150;
        auVar235._4_4_ = (float)local_9a0._4_4_ * fVar164;
        auVar235._8_4_ = fStack_998 * fVar149;
        auVar235._12_4_ = fStack_994 * fVar166;
        auVar235._16_4_ = fStack_990 * fVar168;
        auVar235._20_4_ = fStack_98c * fVar173;
        auVar235._24_4_ = fStack_988 * fVar170;
        auVar235._28_4_ = 0;
        auVar215 = vsubps_avx(auVar235,ZEXT1632(auVar155));
        auVar69._4_4_ = (float)local_9c0._4_4_ * fVar164;
        auVar69._0_4_ = (float)local_9c0._0_4_ * fVar150;
        auVar69._8_4_ = fStack_9b8 * fVar149;
        auVar69._12_4_ = fStack_9b4 * fVar166;
        auVar69._16_4_ = fStack_9b0 * fVar168;
        auVar69._20_4_ = fStack_9ac * fVar173;
        auVar69._24_4_ = fStack_9a8 * fVar170;
        auVar69._28_4_ = 0;
        auVar15 = vsubps_avx(auVar69,ZEXT1632(auVar229));
        _local_c80 = auVar15._0_28_;
        auVar70._4_4_ = fVar163 * (float)local_6c0._4_4_;
        auVar70._0_4_ = fVar172 * (float)local_6c0._0_4_;
        auVar70._8_4_ = fVar174 * fStack_6b8;
        auVar70._12_4_ = fVar175 * fStack_6b4;
        auVar70._16_4_ = fVar165 * fStack_6b0;
        auVar70._20_4_ = fVar288 * fStack_6ac;
        auVar70._24_4_ = fVar289 * fStack_6a8;
        auVar70._28_4_ = auVar15._28_4_;
        auVar196 = vsubps_avx(auVar70,ZEXT1632(auVar133));
        auVar71._4_4_ = (float)local_9a0._4_4_ * fVar163;
        auVar71._0_4_ = (float)local_9a0._0_4_ * fVar172;
        auVar71._8_4_ = fStack_998 * fVar174;
        auVar71._12_4_ = fStack_994 * fVar175;
        auVar71._16_4_ = fStack_990 * fVar165;
        auVar71._20_4_ = fStack_98c * fVar288;
        auVar71._24_4_ = fStack_988 * fVar289;
        auVar71._28_4_ = 0;
        auVar234 = vsubps_avx(auVar71,ZEXT1632(auVar98));
        auVar72._4_4_ = (float)local_9c0._4_4_ * fVar163;
        auVar72._0_4_ = (float)local_9c0._0_4_ * fVar172;
        auVar72._8_4_ = fStack_9b8 * fVar174;
        auVar72._12_4_ = fStack_9b4 * fVar175;
        auVar72._16_4_ = fStack_9b0 * fVar165;
        auVar72._20_4_ = fStack_9ac * fVar288;
        auVar72._24_4_ = fStack_9a8 * fVar289;
        auVar72._28_4_ = uStack_6a4;
        auVar15 = vsubps_avx(auVar72,ZEXT1632(auVar258));
        auVar274 = auVar15._0_28_;
        auVar22 = vcmpps_avx(auVar22,_DAT_01f7b000,5);
        auVar158._8_4_ = 0x7f800000;
        auVar158._0_8_ = 0x7f8000007f800000;
        auVar158._12_4_ = 0x7f800000;
        auVar158._16_4_ = 0x7f800000;
        auVar158._20_4_ = 0x7f800000;
        auVar158._24_4_ = 0x7f800000;
        auVar158._28_4_ = 0x7f800000;
        auVar243 = vblendvps_avx(auVar158,auVar65,auVar22);
        auVar15 = vmaxps_avx(local_600,local_420);
        auVar73._4_4_ = auVar15._4_4_ * 1.9073486e-06;
        auVar73._0_4_ = auVar15._0_4_ * 1.9073486e-06;
        auVar73._8_4_ = auVar15._8_4_ * 1.9073486e-06;
        auVar73._12_4_ = auVar15._12_4_ * 1.9073486e-06;
        auVar73._16_4_ = auVar15._16_4_ * 1.9073486e-06;
        auVar73._20_4_ = auVar15._20_4_ * 1.9073486e-06;
        auVar73._24_4_ = auVar15._24_4_ * 1.9073486e-06;
        auVar73._28_4_ = auVar15._28_4_;
        auVar15 = vcmpps_avx(local_440,auVar73,1);
        auVar159._8_4_ = 0xff800000;
        auVar159._0_8_ = 0xff800000ff800000;
        auVar159._12_4_ = 0xff800000;
        auVar159._16_4_ = 0xff800000;
        auVar159._20_4_ = 0xff800000;
        auVar159._24_4_ = 0xff800000;
        auVar159._28_4_ = 0xff800000;
        auVar261 = vblendvps_avx(auVar159,auVar66,auVar22);
        auVar232 = auVar22 & auVar15;
        if ((((((((auVar232 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar232 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar232 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar232 >> 0x7f,0) != '\0') ||
              (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar232 >> 0xbf,0) != '\0') ||
            (auVar232 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar232[0x1f] < '\0') {
          auVar116 = vandps_avx(auVar22,auVar15);
          auVar15 = vcmpps_avx(auVar21,_DAT_01f7b000,2);
          auVar250._8_4_ = 0xff800000;
          auVar250._0_8_ = 0xff800000ff800000;
          auVar250._12_4_ = 0xff800000;
          auVar250._16_4_ = 0xff800000;
          auVar250._20_4_ = 0xff800000;
          auVar250._24_4_ = 0xff800000;
          auVar250._28_4_ = 0xff800000;
          auVar255._8_4_ = 0x7f800000;
          auVar255._0_8_ = 0x7f8000007f800000;
          auVar255._12_4_ = 0x7f800000;
          auVar255._16_4_ = 0x7f800000;
          auVar255._20_4_ = 0x7f800000;
          auVar255._24_4_ = 0x7f800000;
          auVar255._28_4_ = 0x7f800000;
          auVar21 = vblendvps_avx(auVar255,auVar250,auVar15);
          auVar101 = vpackssdw_avx(auVar116._0_16_,auVar116._16_16_);
          auVar232 = vpmovsxwd_avx2(auVar101);
          auVar243 = vblendvps_avx(auVar243,auVar21,auVar232);
          auVar21 = vblendvps_avx(auVar250,auVar255,auVar15);
          auVar261 = vblendvps_avx(auVar261,auVar21,auVar232);
          auVar162._0_8_ = auVar116._0_8_ ^ 0xffffffffffffffff;
          auVar162._8_4_ = auVar116._8_4_ ^ 0xffffffff;
          auVar162._12_4_ = auVar116._12_4_ ^ 0xffffffff;
          auVar162._16_4_ = auVar116._16_4_ ^ 0xffffffff;
          auVar162._20_4_ = auVar116._20_4_ ^ 0xffffffff;
          auVar162._24_4_ = auVar116._24_4_ ^ 0xffffffff;
          auVar162._28_4_ = auVar116._28_4_ ^ 0xffffffff;
          auVar116 = vorps_avx(auVar15,auVar162);
          auVar116 = vandps_avx(auVar22,auVar116);
        }
        auVar256 = ZEXT3264(auVar20);
      }
      auVar263 = ZEXT3264(auVar261);
      local_4e0 = local_920;
      local_4c0 = vminps_avx(local_480,auVar243);
      _local_880 = vmaxps_avx(local_920,auVar261);
      _local_4a0 = _local_880;
      auVar21 = vcmpps_avx(local_920,local_4c0,2);
      local_640 = vandps_avx(auVar21,auVar108);
      auVar21 = vcmpps_avx(_local_880,local_480,2);
      local_8a0 = vandps_avx(auVar21,auVar108);
      auVar108 = vorps_avx(local_8a0,local_640);
      if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar108 >> 0x7f,0) == '\0') &&
            (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar108 >> 0xbf,0) == '\0') &&
          (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar108[0x1f]) goto LAB_014253e8;
      auStack_938 = auVar140._8_24_;
      auVar74._4_4_ = auVar274._4_4_ * (float)local_9c0._4_4_;
      auVar74._0_4_ = auVar274._0_4_ * (float)local_9c0._0_4_;
      auVar74._8_4_ = auVar274._8_4_ * fStack_9b8;
      auVar74._12_4_ = auVar274._12_4_ * fStack_9b4;
      auVar74._16_4_ = auVar274._16_4_ * fStack_9b0;
      auVar74._20_4_ = auVar274._20_4_ * fStack_9ac;
      auVar74._24_4_ = auVar274._24_4_ * fStack_9a8;
      auVar74._28_4_ = auVar108._28_4_;
      auVar101 = vfmadd213ps_fma(auVar234,_local_9a0,auVar74);
      auVar101 = vfmadd213ps_fma(auVar196,_local_6c0,ZEXT1632(auVar101));
      auVar118._0_8_ = auVar116._0_8_ ^ 0xffffffffffffffff;
      auVar118._8_4_ = auVar116._8_4_ ^ 0xffffffff;
      auVar118._12_4_ = auVar116._12_4_ ^ 0xffffffff;
      auVar118._16_4_ = auVar116._16_4_ ^ 0xffffffff;
      auVar118._20_4_ = auVar116._20_4_ ^ 0xffffffff;
      auVar118._24_4_ = auVar116._24_4_ ^ 0xffffffff;
      auVar118._28_4_ = auVar116._28_4_ ^ 0xffffffff;
      auVar108 = vandps_avx(ZEXT1632(auVar101),local_6e0);
      auVar200._8_4_ = 0x3e99999a;
      auVar200._0_8_ = 0x3e99999a3e99999a;
      auVar200._12_4_ = 0x3e99999a;
      auVar200._16_4_ = 0x3e99999a;
      auVar200._20_4_ = 0x3e99999a;
      auVar200._24_4_ = 0x3e99999a;
      auVar200._28_4_ = 0x3e99999a;
      auVar108 = vcmpps_avx(auVar108,auVar200,1);
      _local_680 = vorps_avx(auVar108,auVar118);
      auVar75._4_4_ = (float)local_9c0._4_4_ * (float)local_c80._4_4_;
      auVar75._0_4_ = (float)local_9c0._0_4_ * (float)local_c80._0_4_;
      auVar75._8_4_ = fStack_9b8 * fStack_c78;
      auVar75._12_4_ = fStack_9b4 * fStack_c74;
      auVar75._16_4_ = fStack_9b0 * fStack_c70;
      auVar75._20_4_ = fStack_9ac * fStack_c6c;
      auVar75._24_4_ = fStack_9a8 * fStack_c68;
      auVar75._28_4_ = local_680._28_4_;
      auVar101 = vfmadd213ps_fma(auVar215,_local_9a0,auVar75);
      auVar101 = vfmadd213ps_fma(auVar256._0_32_,_local_6c0,ZEXT1632(auVar101));
      auVar256 = ZEXT1664(auVar101);
      auVar108 = vandps_avx(ZEXT1632(auVar101),local_6e0);
      auVar108 = vcmpps_avx(auVar108,auVar200,1);
      auVar108 = vorps_avx(auVar108,auVar118);
      auVar143._8_4_ = 3;
      auVar143._0_8_ = 0x300000003;
      auVar143._12_4_ = 3;
      auVar143._16_4_ = 3;
      auVar143._20_4_ = 3;
      auVar143._24_4_ = 3;
      auVar143._28_4_ = 3;
      auVar161._8_4_ = 2;
      auVar161._0_8_ = 0x200000002;
      auVar161._12_4_ = 2;
      auVar161._16_4_ = 2;
      auVar161._20_4_ = 2;
      auVar161._24_4_ = 2;
      auVar161._28_4_ = 2;
      auVar108 = vblendvps_avx(auVar161,auVar143,auVar108);
      local_6a0._4_4_ = local_c84;
      local_6a0._0_4_ = local_c84;
      local_6a0._8_4_ = local_c84;
      local_6a0._12_4_ = local_c84;
      local_6a0._16_4_ = local_c84;
      local_6a0._20_4_ = local_c84;
      local_6a0._24_4_ = local_c84;
      local_6a0._28_4_ = local_c84;
      local_660 = vpcmpgtd_avx2(auVar108,local_6a0);
      auVar108 = vpandn_avx2(local_660,local_640);
      local_860._4_4_ = local_920._4_4_ + (float)local_900._4_4_;
      local_860._0_4_ = local_920._0_4_ + (float)local_900._0_4_;
      fStack_858 = local_920._8_4_ + fStack_8f8;
      fStack_854 = local_920._12_4_ + fStack_8f4;
      fStack_850 = local_920._16_4_ + fStack_8f0;
      fStack_84c = local_920._20_4_ + fStack_8ec;
      fStack_848 = local_920._24_4_ + fStack_8e8;
      fStack_844 = local_920._28_4_ + fStack_8e4;
      while( true ) {
        local_500 = auVar108;
        fStack_bcc = auVar6._4_4_;
        fStack_bc8 = auVar6._8_4_;
        fStack_bc4 = auVar6._12_4_;
        if ((((((((auVar108 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar108 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar108 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar108 >> 0x7f,0) == '\0') &&
              (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar108 >> 0xbf,0) == '\0') &&
            (auVar108 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar108[0x1f]) break;
        auVar144._8_4_ = 0x7f800000;
        auVar144._0_8_ = 0x7f8000007f800000;
        auVar144._12_4_ = 0x7f800000;
        auVar144._16_4_ = 0x7f800000;
        auVar144._20_4_ = 0x7f800000;
        auVar144._24_4_ = 0x7f800000;
        auVar144._28_4_ = 0x7f800000;
        auVar116 = vblendvps_avx(auVar144,local_920,auVar108);
        auVar21 = vshufps_avx(auVar116,auVar116,0xb1);
        auVar21 = vminps_avx(auVar116,auVar21);
        auVar22 = vshufpd_avx(auVar21,auVar21,5);
        auVar21 = vminps_avx(auVar21,auVar22);
        auVar22 = vpermpd_avx2(auVar21,0x4e);
        auVar21 = vminps_avx(auVar21,auVar22);
        auVar116 = vcmpps_avx(auVar116,auVar21,0);
        auVar21 = auVar108 & auVar116;
        if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0x7f,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0xbf,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar21[0x1f] < '\0') {
          auVar108 = vandps_avx(auVar116,auVar108);
        }
        uVar84 = vmovmskps_avx(auVar108);
        iVar23 = 0;
        for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
          iVar23 = iVar23 + 1;
        }
        uVar87 = iVar23 << 2;
        *(undefined4 *)(local_500 + uVar87) = 0;
        uVar84 = *(uint *)(local_1a0 + uVar87);
        uVar87 = *(uint *)(local_4e0 + uVar87);
        fVar150 = auVar3._0_4_;
        if ((float)local_9e0._0_4_ < 0.0) {
          auVar256 = ZEXT1664(auVar256._0_16_);
          auVar263 = ZEXT1664(auVar263._0_16_);
          fVar150 = sqrtf((float)local_9e0._0_4_);
        }
        auVar133 = vminps_avx(local_ac0._0_16_,auVar5);
        auVar101 = vmaxps_avx(local_ac0._0_16_,auVar5);
        auVar155 = vminps_avx(local_ae0._0_16_,auVar6);
        auVar98 = vminps_avx(auVar133,auVar155);
        auVar133 = vmaxps_avx(local_ae0._0_16_,auVar6);
        auVar155 = vmaxps_avx(auVar101,auVar133);
        local_b00._8_4_ = NAN;
        local_b00._0_8_ = 0x7fffffff7fffffff;
        local_b00._12_4_ = NAN;
        auVar101 = vandps_avx(auVar98,local_b00._0_16_);
        auVar133 = vandps_avx(auVar155,local_b00._0_16_);
        auVar101 = vmaxps_avx(auVar101,auVar133);
        auVar133 = vmovshdup_avx(auVar101);
        auVar133 = vmaxss_avx(auVar133,auVar101);
        auVar101 = vshufpd_avx(auVar101,auVar101,1);
        auVar101 = vmaxss_avx(auVar101,auVar133);
        local_a00._0_4_ = auVar101._0_4_ * 1.9073486e-06;
        local_8e0._0_4_ = fVar150 * 1.9073486e-06;
        local_840._0_16_ = vshufps_avx(auVar155,auVar155,0xff);
        auVar101 = vinsertps_avx(ZEXT416(uVar87),ZEXT416(uVar84),0x10);
        auVar278 = ZEXT1664(auVar101);
        lVar88 = 5;
        do {
          do {
            bVar92 = lVar88 == 0;
            lVar88 = lVar88 + -1;
            if (bVar92) goto LAB_01425da8;
            auVar229 = auVar278._0_16_;
            local_b40._0_16_ = vmovshdup_avx(auVar229);
            fVar168 = 1.0 - local_b40._0_4_;
            auVar101 = vshufps_avx(auVar229,auVar229,0x55);
            fVar150 = auVar101._0_4_;
            auVar127._0_4_ = fVar124 * fVar150;
            fVar164 = auVar101._4_4_;
            auVar127._4_4_ = auVar5._4_4_ * fVar164;
            fVar149 = auVar101._8_4_;
            auVar127._8_4_ = auVar5._8_4_ * fVar149;
            fVar166 = auVar101._12_4_;
            auVar127._12_4_ = auVar5._12_4_ * fVar166;
            auVar152._4_4_ = fVar168;
            auVar152._0_4_ = fVar168;
            auVar152._8_4_ = fVar168;
            auVar152._12_4_ = fVar168;
            auVar101 = vfmadd231ps_fma(auVar127,auVar152,local_ac0._0_16_);
            auVar177._0_4_ = local_ae0._0_4_ * fVar150;
            auVar177._4_4_ = local_ae0._4_4_ * fVar164;
            auVar177._8_4_ = local_ae0._8_4_ * fVar149;
            auVar177._12_4_ = local_ae0._12_4_ * fVar166;
            auVar133 = vfmadd231ps_fma(auVar177,auVar152,auVar5);
            auVar220._0_4_ = fVar150 * auVar133._0_4_;
            auVar220._4_4_ = fVar164 * auVar133._4_4_;
            auVar220._8_4_ = fVar149 * auVar133._8_4_;
            auVar220._12_4_ = fVar166 * auVar133._12_4_;
            auVar155 = vfmadd231ps_fma(auVar220,auVar152,auVar101);
            auVar128._0_4_ = fVar150 * fVar125;
            auVar128._4_4_ = fVar164 * fStack_bcc;
            auVar128._8_4_ = fVar149 * fStack_bc8;
            auVar128._12_4_ = fVar166 * fStack_bc4;
            auVar101 = vfmadd231ps_fma(auVar128,auVar152,local_ae0._0_16_);
            auVar203._0_4_ = fVar150 * auVar101._0_4_;
            auVar203._4_4_ = fVar164 * auVar101._4_4_;
            auVar203._8_4_ = fVar149 * auVar101._8_4_;
            auVar203._12_4_ = fVar166 * auVar101._12_4_;
            auVar133 = vfmadd231ps_fma(auVar203,auVar152,auVar133);
            uVar90 = auVar278._0_4_;
            auVar129._4_4_ = uVar90;
            auVar129._0_4_ = uVar90;
            auVar129._8_4_ = uVar90;
            auVar129._12_4_ = uVar90;
            auVar101 = vfmadd213ps_fma(auVar129,local_9d0,_DAT_01f45a50);
            auVar97._0_4_ = fVar150 * auVar133._0_4_;
            auVar97._4_4_ = fVar164 * auVar133._4_4_;
            auVar97._8_4_ = fVar149 * auVar133._8_4_;
            auVar97._12_4_ = fVar166 * auVar133._12_4_;
            auVar98 = vfmadd231ps_fma(auVar97,auVar155,auVar152);
            local_7c0._0_16_ = auVar98;
            auVar101 = vsubps_avx(auVar101,auVar98);
            _local_b80 = auVar101;
            auVar101 = vdpps_avx(auVar101,auVar101,0x7f);
            fVar150 = auVar101._0_4_;
            if (fVar150 < 0.0) {
              local_b60._0_16_ = ZEXT416((uint)fVar168);
              local_a60._0_16_ = auVar155;
              auVar123._0_4_ = sqrtf(fVar150);
              auVar123._4_60_ = extraout_var;
              auVar278 = ZEXT1664(auVar229);
              auVar98 = auVar123._0_16_;
              auVar155 = local_a60._0_16_;
              auVar258 = local_b60._0_16_;
            }
            else {
              auVar98 = vsqrtss_avx(auVar101,auVar101);
              auVar258 = ZEXT416((uint)fVar168);
            }
            auVar133 = vsubps_avx(auVar133,auVar155);
            auVar236._0_4_ = auVar133._0_4_ * 3.0;
            auVar236._4_4_ = auVar133._4_4_ * 3.0;
            auVar236._8_4_ = auVar133._8_4_ * 3.0;
            auVar236._12_4_ = auVar133._12_4_ * 3.0;
            auVar133 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar258,local_b40._0_16_);
            auVar155 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_b40._0_16_,auVar258);
            fVar164 = auVar258._0_4_ * 6.0;
            fVar149 = auVar133._0_4_ * 6.0;
            fVar166 = auVar155._0_4_ * 6.0;
            fVar168 = local_b40._0_4_ * 6.0;
            auVar178._0_4_ = fVar168 * fVar125;
            auVar178._4_4_ = fVar168 * fStack_bcc;
            auVar178._8_4_ = fVar168 * fStack_bc8;
            auVar178._12_4_ = fVar168 * fStack_bc4;
            auVar130._4_4_ = fVar166;
            auVar130._0_4_ = fVar166;
            auVar130._8_4_ = fVar166;
            auVar130._12_4_ = fVar166;
            auVar133 = vfmadd132ps_fma(auVar130,auVar178,local_ae0._0_16_);
            auVar179._4_4_ = fVar149;
            auVar179._0_4_ = fVar149;
            auVar179._8_4_ = fVar149;
            auVar179._12_4_ = fVar149;
            auVar133 = vfmadd132ps_fma(auVar179,auVar133,auVar5);
            auVar155 = vdpps_avx(auVar236,auVar236,0x7f);
            auVar131._4_4_ = fVar164;
            auVar131._0_4_ = fVar164;
            auVar131._8_4_ = fVar164;
            auVar131._12_4_ = fVar164;
            auVar245 = vfmadd132ps_fma(auVar131,auVar133,local_ac0._0_16_);
            auVar133 = vblendps_avx(auVar155,_DAT_01f45a50,0xe);
            auVar258 = vrsqrtss_avx(auVar133,auVar133);
            fVar166 = auVar155._0_4_;
            fVar164 = auVar258._0_4_;
            auVar258 = vdpps_avx(auVar236,auVar245,0x7f);
            fVar164 = fVar164 * 1.5 + fVar166 * -0.5 * fVar164 * fVar164 * fVar164;
            auVar132._0_4_ = auVar245._0_4_ * fVar166;
            auVar132._4_4_ = auVar245._4_4_ * fVar166;
            auVar132._8_4_ = auVar245._8_4_ * fVar166;
            auVar132._12_4_ = auVar245._12_4_ * fVar166;
            fVar149 = auVar258._0_4_;
            auVar221._0_4_ = auVar236._0_4_ * fVar149;
            auVar221._4_4_ = auVar236._4_4_ * fVar149;
            auVar221._8_4_ = auVar236._8_4_ * fVar149;
            auVar221._12_4_ = auVar236._12_4_ * fVar149;
            auVar258 = vsubps_avx(auVar132,auVar221);
            auVar133 = vrcpss_avx(auVar133,auVar133);
            auVar245 = vfnmadd213ss_fma(auVar133,auVar155,ZEXT416(0x40000000));
            fVar149 = auVar133._0_4_ * auVar245._0_4_;
            auVar133 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                  ZEXT416((uint)(auVar278._0_4_ * (float)local_8e0._0_4_)));
            auVar253 = ZEXT1664(auVar133);
            uVar2 = CONCAT44(auVar236._4_4_,auVar236._0_4_);
            auVar230._0_8_ = uVar2 ^ 0x8000000080000000;
            auVar230._8_4_ = -auVar236._8_4_;
            auVar230._12_4_ = -auVar236._12_4_;
            auVar180._0_4_ = fVar164 * auVar258._0_4_ * fVar149;
            auVar180._4_4_ = fVar164 * auVar258._4_4_ * fVar149;
            auVar180._8_4_ = fVar164 * auVar258._8_4_ * fVar149;
            auVar180._12_4_ = fVar164 * auVar258._12_4_ * fVar149;
            auVar271._0_4_ = auVar236._0_4_ * fVar164;
            auVar271._4_4_ = auVar236._4_4_ * fVar164;
            auVar271._8_4_ = auVar236._8_4_ * fVar164;
            auVar271._12_4_ = auVar236._12_4_ * fVar164;
            local_b40._0_16_ = auVar236;
            local_b60._0_4_ = auVar133._0_4_;
            if (fVar166 < -fVar166) {
              local_a60._0_4_ = auVar98._0_4_;
              local_a80._0_16_ = auVar271;
              local_aa0 = auVar180._0_4_;
              fStack_a9c = auVar180._4_4_;
              fStack_a98 = auVar180._8_4_;
              fStack_a94 = auVar180._12_4_;
              fVar164 = sqrtf(fVar166);
              auVar180._4_4_ = fStack_a9c;
              auVar180._0_4_ = local_aa0;
              auVar180._8_4_ = fStack_a98;
              auVar180._12_4_ = fStack_a94;
              auVar98 = ZEXT416((uint)local_a60._0_4_);
              auVar253 = ZEXT464((uint)local_b60._0_4_);
              auVar271 = local_a80._0_16_;
            }
            else {
              auVar133 = vsqrtss_avx(auVar155,auVar155);
              fVar164 = auVar133._0_4_;
            }
            auVar133 = vdpps_avx(_local_b80,auVar271,0x7f);
            auVar245 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar98,auVar253._0_16_);
            auVar155 = vdpps_avx(auVar230,auVar271,0x7f);
            auVar258 = vdpps_avx(_local_b80,auVar180,0x7f);
            auVar16 = vdpps_avx(local_9d0,auVar271,0x7f);
            auVar245 = vfmadd213ss_fma(ZEXT416((uint)(auVar98._0_4_ + 1.0)),
                                       ZEXT416((uint)((float)local_a00._0_4_ / fVar164)),auVar245);
            auVar256 = ZEXT1664(auVar245);
            fVar164 = auVar155._0_4_ + auVar258._0_4_;
            auVar99._0_4_ = auVar133._0_4_ * auVar133._0_4_;
            auVar99._4_4_ = auVar133._4_4_ * auVar133._4_4_;
            auVar99._8_4_ = auVar133._8_4_ * auVar133._8_4_;
            auVar99._12_4_ = auVar133._12_4_ * auVar133._12_4_;
            auVar155 = vdpps_avx(_local_b80,auVar230,0x7f);
            auVar258 = vsubps_avx(auVar101,auVar99);
            auVar98 = vrsqrtss_avx(auVar258,auVar258);
            fVar166 = auVar258._0_4_;
            fVar149 = auVar98._0_4_;
            fVar149 = fVar149 * 1.5 + fVar166 * -0.5 * fVar149 * fVar149 * fVar149;
            auVar98 = vdpps_avx(_local_b80,local_9d0,0x7f);
            auVar155 = vfnmadd231ss_fma(auVar155,auVar133,ZEXT416((uint)fVar164));
            auVar98 = vfnmadd231ss_fma(auVar98,auVar133,auVar16);
            if (fVar166 < 0.0) {
              local_a60._0_16_ = auVar133;
              local_a80._0_16_ = ZEXT416((uint)fVar164);
              local_aa0 = auVar16._0_4_;
              fStack_a9c = auVar16._4_4_;
              fStack_a98 = auVar16._8_4_;
              fStack_a94 = auVar16._12_4_;
              local_7e0._0_16_ = auVar155;
              local_800._0_4_ = fVar149;
              local_820._0_16_ = auVar98;
              fVar166 = sqrtf(fVar166);
              auVar16._4_4_ = fStack_a9c;
              auVar16._0_4_ = local_aa0;
              auVar16._8_4_ = fStack_a98;
              auVar16._12_4_ = fStack_a94;
              auVar256 = ZEXT464(auVar245._0_4_);
              auVar253 = ZEXT464((uint)local_b60._0_4_);
              fVar149 = (float)local_800._0_4_;
              auVar98 = local_820._0_16_;
              auVar133 = local_a60._0_16_;
              auVar155 = local_7e0._0_16_;
              auVar258 = local_a80._0_16_;
            }
            else {
              auVar258 = vsqrtss_avx(auVar258,auVar258);
              fVar166 = auVar258._0_4_;
              auVar258 = ZEXT416((uint)fVar164);
            }
            auVar263 = ZEXT1664(auVar133);
            auVar245 = vpermilps_avx(local_7c0._0_16_,0xff);
            fVar166 = fVar166 - auVar245._0_4_;
            auVar245 = vshufps_avx(local_b40._0_16_,local_b40._0_16_,0xff);
            auVar155 = vfmsub213ss_fma(auVar155,ZEXT416((uint)fVar149),auVar245);
            auVar181._0_8_ = auVar16._0_8_ ^ 0x8000000080000000;
            auVar181._8_4_ = auVar16._8_4_ ^ 0x80000000;
            auVar181._12_4_ = auVar16._12_4_ ^ 0x80000000;
            auVar204._0_8_ = auVar155._0_8_ ^ 0x8000000080000000;
            auVar204._8_4_ = auVar155._8_4_ ^ 0x80000000;
            auVar204._12_4_ = auVar155._12_4_ ^ 0x80000000;
            auVar95 = ZEXT416((uint)(auVar98._0_4_ * fVar149));
            auVar98 = vfmsub231ss_fma(ZEXT416((uint)(auVar16._0_4_ * auVar155._0_4_)),auVar258,
                                      auVar95);
            auVar155 = vinsertps_avx(auVar204,auVar95,0x1c);
            uVar90 = auVar98._0_4_;
            auVar205._4_4_ = uVar90;
            auVar205._0_4_ = uVar90;
            auVar205._8_4_ = uVar90;
            auVar205._12_4_ = uVar90;
            auVar155 = vdivps_avx(auVar155,auVar205);
            auVar98 = vinsertps_avx(auVar258,auVar181,0x10);
            auVar98 = vdivps_avx(auVar98,auVar205);
            fVar164 = auVar133._0_4_;
            auVar153._0_4_ = fVar164 * auVar155._0_4_ + fVar166 * auVar98._0_4_;
            auVar153._4_4_ = fVar164 * auVar155._4_4_ + fVar166 * auVar98._4_4_;
            auVar153._8_4_ = fVar164 * auVar155._8_4_ + fVar166 * auVar98._8_4_;
            auVar153._12_4_ = fVar164 * auVar155._12_4_ + fVar166 * auVar98._12_4_;
            auVar98 = vsubps_avx(auVar229,auVar153);
            auVar278 = ZEXT1664(auVar98);
            auVar155 = vandps_avx(auVar133,local_b00._0_16_);
          } while (auVar256._0_4_ <= auVar155._0_4_);
          auVar229 = vfmadd231ss_fma(ZEXT416((uint)(auVar253._0_4_ + auVar256._0_4_)),
                                     local_840._0_16_,ZEXT416(0x36000000));
          auVar155 = vandps_avx(ZEXT416((uint)fVar166),local_b00._0_16_);
        } while (auVar229._0_4_ <= auVar155._0_4_);
        fVar164 = auVar98._0_4_ + (float)local_970._0_4_;
        if ((fVar93 <= fVar164) && (fVar149 = *(float *)(ray + k * 4 + 0x80), fVar164 <= fVar149)) {
          auVar155 = vmovshdup_avx(auVar98);
          fVar166 = auVar155._0_4_;
          if ((0.0 <= fVar166) && (fVar166 <= 1.0)) {
            auVar101 = vrsqrtss_avx(auVar101,auVar101);
            fVar168 = auVar101._0_4_;
            pGVar9 = (context->scene->geometries).items[uVar91].ptr;
            if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
              fVar150 = fVar168 * 1.5 + fVar150 * -0.5 * fVar168 * fVar168 * fVar168;
              auVar182._0_4_ = fVar150 * (float)local_b80._0_4_;
              auVar182._4_4_ = fVar150 * (float)local_b80._4_4_;
              auVar182._8_4_ = fVar150 * fStack_b78;
              auVar182._12_4_ = fVar150 * fStack_b74;
              auVar258 = vfmadd213ps_fma(auVar245,auVar182,local_b40._0_16_);
              auVar101 = vshufps_avx(auVar182,auVar182,0xc9);
              auVar155 = vshufps_avx(local_b40._0_16_,local_b40._0_16_,0xc9);
              auVar183._0_4_ = auVar182._0_4_ * auVar155._0_4_;
              auVar183._4_4_ = auVar182._4_4_ * auVar155._4_4_;
              auVar183._8_4_ = auVar182._8_4_ * auVar155._8_4_;
              auVar183._12_4_ = auVar182._12_4_ * auVar155._12_4_;
              auVar229 = vfmsub231ps_fma(auVar183,local_b40._0_16_,auVar101);
              auVar101 = vshufps_avx(auVar229,auVar229,0xc9);
              auVar155 = vshufps_avx(auVar258,auVar258,0xc9);
              auVar229 = vshufps_avx(auVar229,auVar229,0xd2);
              auVar100._0_4_ = auVar258._0_4_ * auVar229._0_4_;
              auVar100._4_4_ = auVar258._4_4_ * auVar229._4_4_;
              auVar100._8_4_ = auVar258._8_4_ * auVar229._8_4_;
              auVar100._12_4_ = auVar258._12_4_ * auVar229._12_4_;
              auVar101 = vfmsub231ps_fma(auVar100,auVar101,auVar155);
              uVar90 = auVar101._0_4_;
              if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                 (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                *(float *)(ray + k * 4 + 0x80) = fVar164;
                uVar8 = vextractps_avx(auVar101,1);
                *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                uVar8 = vextractps_avx(auVar101,2);
                *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                *(undefined4 *)(ray + k * 4 + 0xe0) = uVar90;
                *(float *)(ray + k * 4 + 0xf0) = fVar166;
                *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                *(int *)(ray + k * 4 + 0x110) = (int)local_940;
                *(uint *)(ray + k * 4 + 0x120) = uVar91;
                *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
              }
              else {
                local_750 = vshufps_avx(auVar98,auVar98,0x55);
                auVar155 = vshufps_avx(auVar101,auVar101,0x55);
                auStack_770 = vshufps_avx(auVar101,auVar101,0xaa);
                local_780 = (RTCHitN  [16])auVar155;
                local_760 = uVar90;
                uStack_75c = uVar90;
                uStack_758 = uVar90;
                uStack_754 = uVar90;
                local_740 = ZEXT416(0) << 0x20;
                local_730 = CONCAT44(uStack_79c,local_7a0);
                uStack_728 = CONCAT44(uStack_794,uStack_798);
                local_720._4_4_ = uStack_78c;
                local_720._0_4_ = local_790;
                local_720._8_4_ = uStack_788;
                local_720._12_4_ = uStack_784;
                vpcmpeqd_avx2(ZEXT1632(local_720),ZEXT1632(local_720));
                uStack_70c = context->user->instID[0];
                local_710 = uStack_70c;
                uStack_708 = uStack_70c;
                uStack_704 = uStack_70c;
                uStack_700 = context->user->instPrimID[0];
                uStack_6fc = uStack_700;
                uStack_6f8 = uStack_700;
                uStack_6f4 = uStack_700;
                *(float *)(ray + k * 4 + 0x80) = fVar164;
                local_8c0._0_16_ = *local_b08;
                local_bb0.valid = (int *)local_8c0;
                local_bb0.geometryUserPtr = pGVar9->userPtr;
                local_bb0.context = context->user;
                local_bb0.hit = local_780;
                local_bb0.N = 4;
                auVar101 = *local_b08;
                local_bb0.ray = (RTCRayN *)ray;
                if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                  auVar256 = ZEXT1664(auVar256._0_16_);
                  auVar263 = ZEXT1664(auVar133);
                  (*pGVar9->intersectionFilterN)(&local_bb0);
                  auVar101 = local_8c0._0_16_;
                }
                if (auVar101 == (undefined1  [16])0x0) {
                  auVar133 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                  auVar133 = auVar133 ^ _DAT_01f46b70;
                }
                else {
                  p_Var14 = context->args->filter;
                  if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                     (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                       RTC_RAY_QUERY_FLAG_INCOHERENT || (((pGVar9->field_8).field_0x2 & 0x40) != 0))
                     )) {
                    auVar256 = ZEXT1664(auVar256._0_16_);
                    auVar263 = ZEXT1664(auVar263._0_16_);
                    (*p_Var14)(&local_bb0);
                    auVar101 = local_8c0._0_16_;
                  }
                  auVar98 = vpcmpeqd_avx(auVar101,_DAT_01f45a50);
                  auVar155 = vpcmpeqd_avx(auVar155,auVar155);
                  auVar133 = auVar98 ^ auVar155;
                  if (auVar101 != (undefined1  [16])0x0) {
                    auVar98 = auVar98 ^ auVar155;
                    auVar101 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])local_bb0.hit);
                    *(undefined1 (*) [16])(local_bb0.ray + 0xc0) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])(local_bb0.hit + 0x10));
                    *(undefined1 (*) [16])(local_bb0.ray + 0xd0) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])(local_bb0.hit + 0x20));
                    *(undefined1 (*) [16])(local_bb0.ray + 0xe0) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])(local_bb0.hit + 0x30));
                    *(undefined1 (*) [16])(local_bb0.ray + 0xf0) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])(local_bb0.hit + 0x40));
                    *(undefined1 (*) [16])(local_bb0.ray + 0x100) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])(local_bb0.hit + 0x50));
                    *(undefined1 (*) [16])(local_bb0.ray + 0x110) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])(local_bb0.hit + 0x60));
                    *(undefined1 (*) [16])(local_bb0.ray + 0x120) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])(local_bb0.hit + 0x70));
                    *(undefined1 (*) [16])(local_bb0.ray + 0x130) = auVar101;
                    auVar101 = vmaskmovps_avx(auVar98,*(undefined1 (*) [16])(local_bb0.hit + 0x80));
                    *(undefined1 (*) [16])(local_bb0.ray + 0x140) = auVar101;
                  }
                }
                auVar102._8_8_ = 0x100000001;
                auVar102._0_8_ = 0x100000001;
                if ((auVar102 & auVar133) == (undefined1  [16])0x0) {
                  *(float *)(ray + k * 4 + 0x80) = fVar149;
                }
              }
            }
          }
        }
LAB_01425da8:
        uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar251._4_4_ = uVar90;
        auVar251._0_4_ = uVar90;
        auVar251._8_4_ = uVar90;
        auVar251._12_4_ = uVar90;
        auVar251._16_4_ = uVar90;
        auVar251._20_4_ = uVar90;
        auVar251._24_4_ = uVar90;
        auVar251._28_4_ = uVar90;
        auVar253 = ZEXT3264(auVar251);
        auVar108 = vcmpps_avx(_local_860,auVar251,2);
        auVar108 = vandps_avx(auVar108,local_500);
      }
      auVar119._0_4_ = (float)local_900._0_4_ + (float)local_880._0_4_;
      auVar119._4_4_ = (float)local_900._4_4_ + (float)local_880._4_4_;
      auVar119._8_4_ = fStack_8f8 + fStack_878;
      auVar119._12_4_ = fStack_8f4 + fStack_874;
      auVar119._16_4_ = fStack_8f0 + fStack_870;
      auVar119._20_4_ = fStack_8ec + fStack_86c;
      auVar119._24_4_ = fStack_8e8 + fStack_868;
      auVar119._28_4_ = fStack_8e4 + fStack_864;
      uVar90 = auVar253._0_4_;
      auVar145._4_4_ = uVar90;
      auVar145._0_4_ = uVar90;
      auVar145._8_4_ = uVar90;
      auVar145._12_4_ = uVar90;
      auVar145._16_4_ = uVar90;
      auVar145._20_4_ = uVar90;
      auVar145._24_4_ = uVar90;
      auVar145._28_4_ = uVar90;
      auVar108 = vcmpps_avx(auVar119,auVar145,2);
      _local_880 = vandps_avx(auVar108,local_8a0);
      auVar120._8_4_ = 3;
      auVar120._0_8_ = 0x300000003;
      auVar120._12_4_ = 3;
      auVar120._16_4_ = 3;
      auVar120._20_4_ = 3;
      auVar120._24_4_ = 3;
      auVar120._28_4_ = 3;
      auVar146._8_4_ = 2;
      auVar146._0_8_ = 0x200000002;
      auVar146._12_4_ = 2;
      auVar146._16_4_ = 2;
      auVar146._20_4_ = 2;
      auVar146._24_4_ = 2;
      auVar146._28_4_ = 2;
      auVar108 = vblendvps_avx(auVar146,auVar120,_local_680);
      local_8a0 = vpcmpgtd_avx2(auVar108,local_6a0);
      local_8c0 = vpandn_avx2(local_8a0,_local_880);
      local_920 = _local_4a0;
      local_860._4_4_ = (float)local_900._4_4_ + (float)local_4a0._4_4_;
      local_860._0_4_ = (float)local_900._0_4_ + (float)local_4a0._0_4_;
      fStack_858 = fStack_8f8 + fStack_498;
      fStack_854 = fStack_8f4 + fStack_494;
      fStack_850 = fStack_8f0 + fStack_490;
      fStack_84c = fStack_8ec + fStack_48c;
      fStack_848 = fStack_8e8 + fStack_488;
      fStack_844 = fStack_8e4 + fStack_484;
      auVar284 = ZEXT3264(local_a20);
      auVar278 = ZEXT3264(local_a40);
      while( true ) {
        if ((((((((local_8c0 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (local_8c0 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (local_8c0 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(local_8c0 >> 0x7f,0) == '\0') &&
              (local_8c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(local_8c0 >> 0xbf,0) == '\0') &&
            (local_8c0 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < local_8c0[0x1f]) break;
        auVar147._8_4_ = 0x7f800000;
        auVar147._0_8_ = 0x7f8000007f800000;
        auVar147._12_4_ = 0x7f800000;
        auVar147._16_4_ = 0x7f800000;
        auVar147._20_4_ = 0x7f800000;
        auVar147._24_4_ = 0x7f800000;
        auVar147._28_4_ = 0x7f800000;
        auVar108 = vblendvps_avx(auVar147,local_920,local_8c0);
        auVar116 = vshufps_avx(auVar108,auVar108,0xb1);
        auVar116 = vminps_avx(auVar108,auVar116);
        auVar21 = vshufpd_avx(auVar116,auVar116,5);
        auVar116 = vminps_avx(auVar116,auVar21);
        auVar21 = vpermpd_avx2(auVar116,0x4e);
        auVar116 = vminps_avx(auVar116,auVar21);
        auVar116 = vcmpps_avx(auVar108,auVar116,0);
        auVar21 = local_8c0 & auVar116;
        auVar108 = local_8c0;
        if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar21 >> 0x7f,0) != '\0') ||
              (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0xbf,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar21[0x1f] < '\0') {
          auVar108 = vandps_avx(auVar116,local_8c0);
        }
        uVar84 = vmovmskps_avx(auVar108);
        iVar23 = 0;
        for (; (uVar84 & 1) == 0; uVar84 = uVar84 >> 1 | 0x80000000) {
          iVar23 = iVar23 + 1;
        }
        uVar87 = iVar23 << 2;
        *(undefined4 *)(local_8c0 + uVar87) = 0;
        uVar84 = *(uint *)(local_1c0 + uVar87);
        uVar87 = *(uint *)(local_480 + uVar87);
        fVar150 = auVar4._0_4_;
        if ((float)local_9e0._0_4_ < 0.0) {
          auVar256 = ZEXT1664(auVar256._0_16_);
          auVar263 = ZEXT1664(auVar263._0_16_);
          fVar150 = sqrtf((float)local_9e0._0_4_);
          auVar278 = ZEXT3264(local_a40);
          auVar284 = ZEXT3264(local_a20);
        }
        auVar133 = vminps_avx(local_ac0._0_16_,auVar5);
        auVar101 = vmaxps_avx(local_ac0._0_16_,auVar5);
        auVar155 = vminps_avx(local_ae0._0_16_,auVar6);
        auVar98 = vminps_avx(auVar133,auVar155);
        auVar133 = vmaxps_avx(local_ae0._0_16_,auVar6);
        auVar155 = vmaxps_avx(auVar101,auVar133);
        local_8e0._8_4_ = NAN;
        local_8e0._0_8_ = 0x7fffffff7fffffff;
        local_8e0._12_4_ = NAN;
        auVar101 = vandps_avx(auVar98,local_8e0._0_16_);
        auVar133 = vandps_avx(auVar155,local_8e0._0_16_);
        auVar101 = vmaxps_avx(auVar101,auVar133);
        auVar133 = vmovshdup_avx(auVar101);
        auVar133 = vmaxss_avx(auVar133,auVar101);
        auVar101 = vshufpd_avx(auVar101,auVar101,1);
        auVar101 = vmaxss_avx(auVar101,auVar133);
        local_a00._0_4_ = auVar101._0_4_ * 1.9073486e-06;
        local_a60._0_4_ = fVar150 * 1.9073486e-06;
        local_840._0_16_ = vshufps_avx(auVar155,auVar155,0xff);
        auVar101 = vinsertps_avx(ZEXT416(uVar87),ZEXT416(uVar84),0x10);
        auVar253 = ZEXT1664(auVar101);
        lVar88 = 5;
        do {
          do {
            bVar92 = lVar88 == 0;
            lVar88 = lVar88 + -1;
            if (bVar92) goto LAB_0142686f;
            auVar229 = auVar253._0_16_;
            local_b40._0_16_ = vmovshdup_avx(auVar229);
            fVar168 = 1.0 - local_b40._0_4_;
            auVar101 = vshufps_avx(auVar229,auVar229,0x55);
            fVar150 = auVar101._0_4_;
            auVar134._0_4_ = fVar124 * fVar150;
            fVar164 = auVar101._4_4_;
            auVar134._4_4_ = auVar5._4_4_ * fVar164;
            fVar149 = auVar101._8_4_;
            auVar134._8_4_ = auVar5._8_4_ * fVar149;
            fVar166 = auVar101._12_4_;
            auVar134._12_4_ = auVar5._12_4_ * fVar166;
            auVar154._4_4_ = fVar168;
            auVar154._0_4_ = fVar168;
            auVar154._8_4_ = fVar168;
            auVar154._12_4_ = fVar168;
            auVar101 = vfmadd231ps_fma(auVar134,auVar154,local_ac0._0_16_);
            auVar184._0_4_ = local_ae0._0_4_ * fVar150;
            auVar184._4_4_ = local_ae0._4_4_ * fVar164;
            auVar184._8_4_ = local_ae0._8_4_ * fVar149;
            auVar184._12_4_ = local_ae0._12_4_ * fVar166;
            auVar133 = vfmadd231ps_fma(auVar184,auVar154,auVar5);
            auVar222._0_4_ = fVar150 * auVar133._0_4_;
            auVar222._4_4_ = fVar164 * auVar133._4_4_;
            auVar222._8_4_ = fVar149 * auVar133._8_4_;
            auVar222._12_4_ = fVar166 * auVar133._12_4_;
            auVar155 = vfmadd231ps_fma(auVar222,auVar154,auVar101);
            auVar135._0_4_ = fVar150 * fVar125;
            auVar135._4_4_ = fVar164 * fStack_bcc;
            auVar135._8_4_ = fVar149 * fStack_bc8;
            auVar135._12_4_ = fVar166 * fStack_bc4;
            auVar101 = vfmadd231ps_fma(auVar135,auVar154,local_ae0._0_16_);
            auVar206._0_4_ = fVar150 * auVar101._0_4_;
            auVar206._4_4_ = fVar164 * auVar101._4_4_;
            auVar206._8_4_ = fVar149 * auVar101._8_4_;
            auVar206._12_4_ = fVar166 * auVar101._12_4_;
            auVar133 = vfmadd231ps_fma(auVar206,auVar154,auVar133);
            uVar90 = auVar253._0_4_;
            auVar136._4_4_ = uVar90;
            auVar136._0_4_ = uVar90;
            auVar136._8_4_ = uVar90;
            auVar136._12_4_ = uVar90;
            auVar101 = vfmadd213ps_fma(auVar136,local_9d0,_DAT_01f45a50);
            auVar103._0_4_ = fVar150 * auVar133._0_4_;
            auVar103._4_4_ = fVar164 * auVar133._4_4_;
            auVar103._8_4_ = fVar149 * auVar133._8_4_;
            auVar103._12_4_ = fVar166 * auVar133._12_4_;
            auVar98 = vfmadd231ps_fma(auVar103,auVar155,auVar154);
            local_7c0._0_16_ = auVar98;
            auVar101 = vsubps_avx(auVar101,auVar98);
            _local_b80 = auVar101;
            auVar101 = vdpps_avx(auVar101,auVar101,0x7f);
            fVar150 = auVar101._0_4_;
            if (fVar150 < 0.0) {
              local_b60._0_16_ = ZEXT416((uint)fVar168);
              local_b00._0_16_ = auVar155;
              auVar256._0_4_ = sqrtf(fVar150);
              auVar256._4_60_ = extraout_var_00;
              auVar253 = ZEXT1664(auVar229);
              auVar98 = auVar256._0_16_;
              auVar155 = local_b00._0_16_;
              auVar258 = local_b60._0_16_;
            }
            else {
              auVar98 = vsqrtss_avx(auVar101,auVar101);
              auVar258 = ZEXT416((uint)fVar168);
            }
            auVar133 = vsubps_avx(auVar133,auVar155);
            auVar237._0_4_ = auVar133._0_4_ * 3.0;
            auVar237._4_4_ = auVar133._4_4_ * 3.0;
            auVar237._8_4_ = auVar133._8_4_ * 3.0;
            auVar237._12_4_ = auVar133._12_4_ * 3.0;
            auVar133 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),auVar258,local_b40._0_16_);
            auVar155 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc0000000),0),local_b40._0_16_,auVar258);
            fVar164 = auVar258._0_4_ * 6.0;
            fVar149 = auVar133._0_4_ * 6.0;
            fVar166 = auVar155._0_4_ * 6.0;
            fVar168 = local_b40._0_4_ * 6.0;
            auVar185._0_4_ = fVar168 * fVar125;
            auVar185._4_4_ = fVar168 * fStack_bcc;
            auVar185._8_4_ = fVar168 * fStack_bc8;
            auVar185._12_4_ = fVar168 * fStack_bc4;
            auVar137._4_4_ = fVar166;
            auVar137._0_4_ = fVar166;
            auVar137._8_4_ = fVar166;
            auVar137._12_4_ = fVar166;
            auVar133 = vfmadd132ps_fma(auVar137,auVar185,local_ae0._0_16_);
            auVar186._4_4_ = fVar149;
            auVar186._0_4_ = fVar149;
            auVar186._8_4_ = fVar149;
            auVar186._12_4_ = fVar149;
            auVar133 = vfmadd132ps_fma(auVar186,auVar133,auVar5);
            auVar155 = vdpps_avx(auVar237,auVar237,0x7f);
            auVar138._4_4_ = fVar164;
            auVar138._0_4_ = fVar164;
            auVar138._8_4_ = fVar164;
            auVar138._12_4_ = fVar164;
            auVar245 = vfmadd132ps_fma(auVar138,auVar133,local_ac0._0_16_);
            auVar133 = vblendps_avx(auVar155,_DAT_01f45a50,0xe);
            auVar258 = vrsqrtss_avx(auVar133,auVar133);
            fVar166 = auVar155._0_4_;
            fVar164 = auVar258._0_4_;
            auVar258 = vdpps_avx(auVar237,auVar245,0x7f);
            fVar164 = fVar164 * 1.5 + fVar166 * -0.5 * fVar164 * fVar164 * fVar164;
            auVar139._0_4_ = auVar245._0_4_ * fVar166;
            auVar139._4_4_ = auVar245._4_4_ * fVar166;
            auVar139._8_4_ = auVar245._8_4_ * fVar166;
            auVar139._12_4_ = auVar245._12_4_ * fVar166;
            fVar149 = auVar258._0_4_;
            auVar223._0_4_ = auVar237._0_4_ * fVar149;
            auVar223._4_4_ = auVar237._4_4_ * fVar149;
            auVar223._8_4_ = auVar237._8_4_ * fVar149;
            auVar223._12_4_ = auVar237._12_4_ * fVar149;
            auVar258 = vsubps_avx(auVar139,auVar223);
            auVar133 = vrcpss_avx(auVar133,auVar133);
            auVar245 = vfnmadd213ss_fma(auVar133,auVar155,ZEXT416(0x40000000));
            fVar149 = auVar133._0_4_ * auVar245._0_4_;
            auVar133 = vmaxss_avx(ZEXT416((uint)local_a00._0_4_),
                                  ZEXT416((uint)(auVar253._0_4_ * (float)local_a60._0_4_)));
            auVar256 = ZEXT1664(auVar133);
            uVar2 = CONCAT44(auVar237._4_4_,auVar237._0_4_);
            auVar273._0_8_ = uVar2 ^ 0x8000000080000000;
            auVar273._8_4_ = -auVar237._8_4_;
            auVar273._12_4_ = -auVar237._12_4_;
            auVar187._0_4_ = fVar164 * auVar258._0_4_ * fVar149;
            auVar187._4_4_ = fVar164 * auVar258._4_4_ * fVar149;
            auVar187._8_4_ = fVar164 * auVar258._8_4_ * fVar149;
            auVar187._12_4_ = fVar164 * auVar258._12_4_ * fVar149;
            auVar231._0_4_ = auVar237._0_4_ * fVar164;
            auVar231._4_4_ = auVar237._4_4_ * fVar164;
            auVar231._8_4_ = auVar237._8_4_ * fVar164;
            auVar231._12_4_ = auVar237._12_4_ * fVar164;
            local_b40._0_16_ = auVar237;
            local_b60._0_4_ = auVar133._0_4_;
            if (fVar166 < -fVar166) {
              local_b00._0_4_ = auVar98._0_4_;
              local_a80._0_16_ = auVar231;
              local_aa0 = auVar187._0_4_;
              fStack_a9c = auVar187._4_4_;
              fStack_a98 = auVar187._8_4_;
              fStack_a94 = auVar187._12_4_;
              fVar164 = sqrtf(fVar166);
              auVar187._4_4_ = fStack_a9c;
              auVar187._0_4_ = local_aa0;
              auVar187._8_4_ = fStack_a98;
              auVar187._12_4_ = fStack_a94;
              auVar98 = ZEXT416((uint)local_b00._0_4_);
              auVar256 = ZEXT464((uint)local_b60._0_4_);
              auVar231 = local_a80._0_16_;
            }
            else {
              auVar133 = vsqrtss_avx(auVar155,auVar155);
              fVar164 = auVar133._0_4_;
            }
            auVar133 = vdpps_avx(_local_b80,auVar231,0x7f);
            auVar95 = vfmadd213ss_fma(ZEXT416((uint)local_a00._0_4_),auVar98,auVar256._0_16_);
            auVar155 = vdpps_avx(auVar273,auVar231,0x7f);
            auVar258 = vdpps_avx(_local_b80,auVar187,0x7f);
            auVar245 = vdpps_avx(local_9d0,auVar231,0x7f);
            auVar95 = vfmadd213ss_fma(ZEXT416((uint)(auVar98._0_4_ + 1.0)),
                                      ZEXT416((uint)((float)local_a00._0_4_ / fVar164)),auVar95);
            fVar164 = auVar155._0_4_ + auVar258._0_4_;
            auVar286 = ZEXT416((uint)fVar164);
            fVar166 = auVar133._0_4_;
            auVar104._0_4_ = fVar166 * fVar166;
            auVar104._4_4_ = auVar133._4_4_ * auVar133._4_4_;
            auVar104._8_4_ = auVar133._8_4_ * auVar133._8_4_;
            auVar104._12_4_ = auVar133._12_4_ * auVar133._12_4_;
            auVar155 = vdpps_avx(_local_b80,auVar273,0x7f);
            auVar258 = vsubps_avx(auVar101,auVar104);
            auVar98 = vrsqrtss_avx(auVar258,auVar258);
            fVar168 = auVar258._0_4_;
            fVar149 = auVar98._0_4_;
            fVar149 = fVar149 * 1.5 + fVar168 * -0.5 * fVar149 * fVar149 * fVar149;
            auVar98 = vdpps_avx(_local_b80,local_9d0,0x7f);
            local_b00._0_16_ = vfnmadd231ss_fma(auVar155,auVar133,ZEXT416((uint)fVar164));
            auVar155 = vfnmadd231ss_fma(auVar98,auVar133,auVar245);
            if (fVar168 < 0.0) {
              local_a80._0_4_ = auVar95._0_4_;
              fStack_a9c = 0.0;
              fStack_a98 = 0.0;
              fStack_a94 = 0.0;
              local_7e0._0_16_ = auVar245;
              local_800._0_4_ = fVar149;
              local_820._0_16_ = auVar155;
              local_aa0 = fVar164;
              fVar164 = sqrtf(fVar168);
              auVar286._4_4_ = fStack_a9c;
              auVar286._0_4_ = local_aa0;
              auVar286._8_4_ = fStack_a98;
              auVar286._12_4_ = fStack_a94;
              auVar256 = ZEXT464((uint)local_b60._0_4_);
              fVar149 = (float)local_800._0_4_;
              auVar155 = local_820._0_16_;
              auVar245 = local_7e0._0_16_;
              fVar168 = (float)local_a80._0_4_;
            }
            else {
              auVar98 = vsqrtss_avx(auVar258,auVar258);
              fVar164 = auVar98._0_4_;
              fVar168 = auVar95._0_4_;
            }
            auVar263 = ZEXT1664(auVar133);
            auVar284 = ZEXT3264(local_a20);
            auVar278 = ZEXT3264(local_a40);
            auVar98 = vpermilps_avx(local_7c0._0_16_,0xff);
            fVar164 = fVar164 - auVar98._0_4_;
            auVar258 = vshufps_avx(local_b40._0_16_,local_b40._0_16_,0xff);
            auVar98 = vfmsub213ss_fma(local_b00._0_16_,ZEXT416((uint)fVar149),auVar258);
            auVar188._0_8_ = auVar245._0_8_ ^ 0x8000000080000000;
            auVar188._8_4_ = auVar245._8_4_ ^ 0x80000000;
            auVar188._12_4_ = auVar245._12_4_ ^ 0x80000000;
            auVar207._0_8_ = auVar98._0_8_ ^ 0x8000000080000000;
            auVar207._8_4_ = auVar98._8_4_ ^ 0x80000000;
            auVar207._12_4_ = auVar98._12_4_ ^ 0x80000000;
            auVar155 = ZEXT416((uint)(auVar155._0_4_ * fVar149));
            auVar98 = vfmsub231ss_fma(ZEXT416((uint)(auVar98._0_4_ * auVar245._0_4_)),auVar286,
                                      auVar155);
            auVar155 = vinsertps_avx(auVar207,auVar155,0x1c);
            uVar90 = auVar98._0_4_;
            auVar208._4_4_ = uVar90;
            auVar208._0_4_ = uVar90;
            auVar208._8_4_ = uVar90;
            auVar208._12_4_ = uVar90;
            auVar155 = vdivps_avx(auVar155,auVar208);
            auVar98 = vinsertps_avx(auVar286,auVar188,0x10);
            auVar98 = vdivps_avx(auVar98,auVar208);
            auVar156._0_4_ = fVar166 * auVar155._0_4_ + fVar164 * auVar98._0_4_;
            auVar156._4_4_ = fVar166 * auVar155._4_4_ + fVar164 * auVar98._4_4_;
            auVar156._8_4_ = fVar166 * auVar155._8_4_ + fVar164 * auVar98._8_4_;
            auVar156._12_4_ = fVar166 * auVar155._12_4_ + fVar164 * auVar98._12_4_;
            auVar98 = vsubps_avx(auVar229,auVar156);
            auVar253 = ZEXT1664(auVar98);
            auVar155 = vandps_avx(auVar133,local_8e0._0_16_);
          } while (fVar168 <= auVar155._0_4_);
          auVar229 = vfmadd231ss_fma(ZEXT416((uint)(auVar256._0_4_ + fVar168)),local_840._0_16_,
                                     ZEXT416(0x36000000));
          auVar155 = vandps_avx(ZEXT416((uint)fVar164),local_8e0._0_16_);
        } while (auVar229._0_4_ <= auVar155._0_4_);
        fVar164 = auVar98._0_4_ + (float)local_970._0_4_;
        if (fVar93 <= fVar164) {
          fVar149 = *(float *)(ray + k * 4 + 0x80);
          auVar256 = ZEXT464((uint)fVar149);
          if (fVar164 <= fVar149) {
            auVar155 = vmovshdup_avx(auVar98);
            fVar166 = auVar155._0_4_;
            if ((0.0 <= fVar166) && (fVar166 <= 1.0)) {
              auVar101 = vrsqrtss_avx(auVar101,auVar101);
              fVar168 = auVar101._0_4_;
              pGVar9 = (context->scene->geometries).items[uVar91].ptr;
              if ((pGVar9->mask & *(uint *)(ray + k * 4 + 0x90)) != 0) {
                fVar150 = fVar168 * 1.5 + fVar150 * -0.5 * fVar168 * fVar168 * fVar168;
                auVar189._0_4_ = fVar150 * (float)local_b80._0_4_;
                auVar189._4_4_ = fVar150 * (float)local_b80._4_4_;
                auVar189._8_4_ = fVar150 * fStack_b78;
                auVar189._12_4_ = fVar150 * fStack_b74;
                auVar258 = vfmadd213ps_fma(auVar258,auVar189,local_b40._0_16_);
                auVar101 = vshufps_avx(auVar189,auVar189,0xc9);
                auVar155 = vshufps_avx(local_b40._0_16_,local_b40._0_16_,0xc9);
                auVar190._0_4_ = auVar189._0_4_ * auVar155._0_4_;
                auVar190._4_4_ = auVar189._4_4_ * auVar155._4_4_;
                auVar190._8_4_ = auVar189._8_4_ * auVar155._8_4_;
                auVar190._12_4_ = auVar189._12_4_ * auVar155._12_4_;
                auVar229 = vfmsub231ps_fma(auVar190,local_b40._0_16_,auVar101);
                auVar101 = vshufps_avx(auVar229,auVar229,0xc9);
                auVar155 = vshufps_avx(auVar258,auVar258,0xc9);
                auVar229 = vshufps_avx(auVar229,auVar229,0xd2);
                auVar105._0_4_ = auVar258._0_4_ * auVar229._0_4_;
                auVar105._4_4_ = auVar258._4_4_ * auVar229._4_4_;
                auVar105._8_4_ = auVar258._8_4_ * auVar229._8_4_;
                auVar105._12_4_ = auVar258._12_4_ * auVar229._12_4_;
                auVar101 = vfmsub231ps_fma(auVar105,auVar101,auVar155);
                uVar90 = auVar101._0_4_;
                if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                   (pGVar9->intersectionFilterN == (RTCFilterFunctionN)0x0)) {
                  *(float *)(ray + k * 4 + 0x80) = fVar164;
                  uVar8 = vextractps_avx(auVar101,1);
                  *(undefined4 *)(ray + k * 4 + 0xc0) = uVar8;
                  uVar8 = vextractps_avx(auVar101,2);
                  *(undefined4 *)(ray + k * 4 + 0xd0) = uVar8;
                  *(undefined4 *)(ray + k * 4 + 0xe0) = uVar90;
                  *(float *)(ray + k * 4 + 0xf0) = fVar166;
                  *(undefined4 *)(ray + k * 4 + 0x100) = 0;
                  *(int *)(ray + k * 4 + 0x110) = (int)local_940;
                  *(uint *)(ray + k * 4 + 0x120) = uVar91;
                  *(uint *)(ray + k * 4 + 0x130) = context->user->instID[0];
                  *(uint *)(ray + k * 4 + 0x140) = context->user->instPrimID[0];
                }
                else {
                  local_750 = vshufps_avx(auVar98,auVar98,0x55);
                  auVar155 = vshufps_avx(auVar101,auVar101,0x55);
                  auStack_770 = vshufps_avx(auVar101,auVar101,0xaa);
                  local_780 = (RTCHitN  [16])auVar155;
                  local_760 = uVar90;
                  uStack_75c = uVar90;
                  uStack_758 = uVar90;
                  uStack_754 = uVar90;
                  local_740 = ZEXT416(0) << 0x20;
                  local_730 = CONCAT44(uStack_79c,local_7a0);
                  uStack_728 = CONCAT44(uStack_794,uStack_798);
                  local_720._4_4_ = uStack_78c;
                  local_720._0_4_ = local_790;
                  local_720._8_4_ = uStack_788;
                  local_720._12_4_ = uStack_784;
                  vpcmpeqd_avx2(ZEXT1632(local_720),ZEXT1632(local_720));
                  uStack_70c = context->user->instID[0];
                  local_710 = uStack_70c;
                  uStack_708 = uStack_70c;
                  uStack_704 = uStack_70c;
                  uStack_700 = context->user->instPrimID[0];
                  uStack_6fc = uStack_700;
                  uStack_6f8 = uStack_700;
                  uStack_6f4 = uStack_700;
                  *(float *)(ray + k * 4 + 0x80) = fVar164;
                  local_960 = *local_b08;
                  local_bb0.valid = (int *)local_960;
                  local_bb0.geometryUserPtr = pGVar9->userPtr;
                  local_bb0.context = context->user;
                  local_bb0.hit = local_780;
                  local_bb0.N = 4;
                  local_bb0.ray = (RTCRayN *)ray;
                  if (pGVar9->intersectionFilterN != (RTCFilterFunctionN)0x0) {
                    auVar263 = ZEXT1664(auVar133);
                    (*pGVar9->intersectionFilterN)(&local_bb0);
                    auVar278 = ZEXT3264(local_a40);
                    auVar284 = ZEXT3264(local_a20);
                  }
                  if (local_960 == (undefined1  [16])0x0) {
                    auVar101 = vpcmpeqd_avx((undefined1  [16])0x0,_DAT_01f45a50);
                    auVar101 = auVar101 ^ _DAT_01f46b70;
                  }
                  else {
                    p_Var14 = context->args->filter;
                    if ((p_Var14 != (RTCFilterFunctionN)0x0) &&
                       (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                         RTC_RAY_QUERY_FLAG_INCOHERENT ||
                        (((pGVar9->field_8).field_0x2 & 0x40) != 0)))) {
                      auVar263 = ZEXT1664(auVar263._0_16_);
                      (*p_Var14)(&local_bb0);
                      auVar278 = ZEXT3264(local_a40);
                      auVar284 = ZEXT3264(local_a20);
                    }
                    auVar133 = vpcmpeqd_avx(local_960,_DAT_01f45a50);
                    auVar155 = vpcmpeqd_avx(auVar155,auVar155);
                    auVar101 = auVar133 ^ auVar155;
                    if (local_960 != (undefined1  [16])0x0) {
                      auVar133 = auVar133 ^ auVar155;
                      auVar155 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])local_bb0.hit);
                      *(undefined1 (*) [16])(local_bb0.ray + 0xc0) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                          (local_bb0.hit + 0x10));
                      *(undefined1 (*) [16])(local_bb0.ray + 0xd0) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                          (local_bb0.hit + 0x20));
                      *(undefined1 (*) [16])(local_bb0.ray + 0xe0) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                          (local_bb0.hit + 0x30));
                      *(undefined1 (*) [16])(local_bb0.ray + 0xf0) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                          (local_bb0.hit + 0x40));
                      *(undefined1 (*) [16])(local_bb0.ray + 0x100) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                          (local_bb0.hit + 0x50));
                      *(undefined1 (*) [16])(local_bb0.ray + 0x110) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                          (local_bb0.hit + 0x60));
                      *(undefined1 (*) [16])(local_bb0.ray + 0x120) = auVar155;
                      auVar155 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                          (local_bb0.hit + 0x70));
                      *(undefined1 (*) [16])(local_bb0.ray + 0x130) = auVar155;
                      auVar133 = vmaskmovps_avx(auVar133,*(undefined1 (*) [16])
                                                          (local_bb0.hit + 0x80));
                      *(undefined1 (*) [16])(local_bb0.ray + 0x140) = auVar133;
                    }
                  }
                  auVar256 = ZEXT464((uint)fVar149);
                  auVar106._8_8_ = 0x100000001;
                  auVar106._0_8_ = 0x100000001;
                  if ((auVar106 & auVar101) == (undefined1  [16])0x0) {
                    *(float *)(ray + k * 4 + 0x80) = fVar149;
                  }
                }
              }
            }
          }
        }
LAB_0142686f:
        uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar252._4_4_ = uVar90;
        auVar252._0_4_ = uVar90;
        auVar252._8_4_ = uVar90;
        auVar252._12_4_ = uVar90;
        auVar252._16_4_ = uVar90;
        auVar252._20_4_ = uVar90;
        auVar252._24_4_ = uVar90;
        auVar252._28_4_ = uVar90;
        auVar253 = ZEXT3264(auVar252);
        auVar108 = vcmpps_avx(_local_860,auVar252,2);
        local_8c0 = vandps_avx(auVar108,local_8c0);
      }
      auVar148._0_4_ = (float)local_900._0_4_ + local_4e0._0_4_;
      auVar148._4_4_ = (float)local_900._4_4_ + local_4e0._4_4_;
      auVar148._8_4_ = fStack_8f8 + local_4e0._8_4_;
      auVar148._12_4_ = fStack_8f4 + local_4e0._12_4_;
      auVar148._16_4_ = fStack_8f0 + local_4e0._16_4_;
      auVar148._20_4_ = fStack_8ec + local_4e0._20_4_;
      auVar148._24_4_ = fStack_8e8 + local_4e0._24_4_;
      auVar148._28_4_ = fStack_8e4 + local_4e0._28_4_;
      uVar90 = auVar253._0_4_;
      auVar201._4_4_ = uVar90;
      auVar201._0_4_ = uVar90;
      auVar201._8_4_ = uVar90;
      auVar201._12_4_ = uVar90;
      auVar201._16_4_ = uVar90;
      auVar201._20_4_ = uVar90;
      auVar201._24_4_ = uVar90;
      auVar201._28_4_ = uVar90;
      auVar116 = vcmpps_avx(auVar148,auVar201,2);
      auVar108 = vandps_avx(local_660,local_640);
      auVar108 = vandps_avx(auVar116,auVar108);
      auVar217._0_4_ = (float)local_900._0_4_ + local_4a0._0_4_;
      auVar217._4_4_ = (float)local_900._4_4_ + local_4a0._4_4_;
      auVar217._8_4_ = fStack_8f8 + local_4a0._8_4_;
      auVar217._12_4_ = fStack_8f4 + local_4a0._12_4_;
      auVar217._16_4_ = fStack_8f0 + local_4a0._16_4_;
      auVar217._20_4_ = fStack_8ec + local_4a0._20_4_;
      auVar217._24_4_ = fStack_8e8 + local_4a0._24_4_;
      auVar217._28_4_ = fStack_8e4 + local_4a0._28_4_;
      auVar21 = vcmpps_avx(auVar217,auVar201,2);
      auVar116 = vandps_avx(local_8a0,_local_880);
      auVar116 = vandps_avx(auVar21,auVar116);
      auVar116 = vorps_avx(auVar108,auVar116);
      fVar150 = (float)local_900._0_4_;
      fVar164 = (float)local_900._4_4_;
      fVar149 = fStack_8f8;
      fVar166 = fStack_8f4;
      fVar168 = fStack_8f0;
      fVar173 = fStack_8ec;
      fVar170 = fStack_8e8;
      fVar172 = fStack_8e4;
      if ((((((((auVar116 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar116 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar116 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar116 >> 0x7f,0) != '\0') ||
            (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar116 >> 0xbf,0) != '\0') ||
          (auVar116 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar116[0x1f] < '\0') {
        *(undefined1 (*) [32])(auStack_180 + uVar86 * 0x60) = auVar116;
        auVar108 = vblendvps_avx(_local_4a0,local_4e0,auVar108);
        *(undefined1 (*) [32])(auStack_160 + uVar86 * 0x60) = auVar108;
        uVar2 = vmovlps_avx(local_610);
        (&uStack_140)[uVar86 * 0xc] = uVar2;
        aiStack_138[uVar86 * 0x18] = local_c84 + 1;
        uVar86 = (ulong)((int)uVar86 + 1);
      }
    }
    while( true ) {
      auVar211 = local_580;
      auVar238 = local_5a0;
      auVar254 = local_5c0;
      auVar260 = local_5e0;
      uVar84 = (uint)uVar86;
      if (uVar84 == 0) {
        uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
        auVar122._4_4_ = uVar90;
        auVar122._0_4_ = uVar90;
        auVar122._8_4_ = uVar90;
        auVar122._12_4_ = uVar90;
        auVar122._16_4_ = uVar90;
        auVar122._20_4_ = uVar90;
        auVar122._24_4_ = uVar90;
        auVar122._28_4_ = uVar90;
        auVar108 = vcmpps_avx(local_3c0,auVar122,2);
        uVar91 = vmovmskps_avx(auVar108);
        uVar85 = (ulong)(uVar91 & (uint)uVar85 - 1 & (uint)uVar85);
        goto LAB_01424499;
      }
      uVar86 = (ulong)(uVar84 - 1);
      lVar88 = uVar86 * 0x60;
      auVar108 = *(undefined1 (*) [32])(auStack_160 + lVar88);
      auVar115._0_4_ = fVar150 + auVar108._0_4_;
      auVar115._4_4_ = fVar164 + auVar108._4_4_;
      auVar115._8_4_ = fVar149 + auVar108._8_4_;
      auVar115._12_4_ = fVar166 + auVar108._12_4_;
      auVar115._16_4_ = fVar168 + auVar108._16_4_;
      auVar115._20_4_ = fVar173 + auVar108._20_4_;
      auVar115._24_4_ = fVar170 + auVar108._24_4_;
      auVar115._28_4_ = fVar172 + auVar108._28_4_;
      uVar90 = *(undefined4 *)(ray + k * 4 + 0x80);
      auVar199._4_4_ = uVar90;
      auVar199._0_4_ = uVar90;
      auVar199._8_4_ = uVar90;
      auVar199._12_4_ = uVar90;
      auVar199._16_4_ = uVar90;
      auVar199._20_4_ = uVar90;
      auVar199._24_4_ = uVar90;
      auVar199._28_4_ = uVar90;
      auVar21 = vcmpps_avx(auVar115,auVar199,2);
      auVar116 = vandps_avx(auVar21,*(undefined1 (*) [32])(auStack_180 + lVar88));
      _local_780 = auVar116;
      auVar21 = *(undefined1 (*) [32])(auStack_180 + lVar88) & auVar21;
      if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar21 >> 0x7f,0) != '\0') ||
            (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0xbf,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar21[0x1f] < '\0') break;
      uVar86 = (ulong)(uVar84 - 1);
    }
    auVar160._8_4_ = 0x7f800000;
    auVar160._0_8_ = 0x7f8000007f800000;
    auVar160._12_4_ = 0x7f800000;
    auVar160._16_4_ = 0x7f800000;
    auVar160._20_4_ = 0x7f800000;
    auVar160._24_4_ = 0x7f800000;
    auVar160._28_4_ = 0x7f800000;
    auVar108 = vblendvps_avx(auVar160,auVar108,auVar116);
    auVar21 = vshufps_avx(auVar108,auVar108,0xb1);
    auVar21 = vminps_avx(auVar108,auVar21);
    auVar22 = vshufpd_avx(auVar21,auVar21,5);
    auVar21 = vminps_avx(auVar21,auVar22);
    auVar22 = vpermpd_avx2(auVar21,0x4e);
    auVar21 = vminps_avx(auVar21,auVar22);
    auVar108 = vcmpps_avx(auVar108,auVar21,0);
    auVar21 = auVar116 & auVar108;
    if ((((((((auVar21 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar21 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar21 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar21 >> 0x7f,0) != '\0') ||
          (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar21 >> 0xbf,0) != '\0') ||
        (auVar21 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar21[0x1f] < '\0')
    {
      auVar116 = vandps_avx(auVar108,auVar116);
    }
    uVar87 = vmovmskps_avx(auVar116);
    iVar23 = 0;
    for (; (uVar87 & 1) == 0; uVar87 = uVar87 >> 1 | 0x80000000) {
      iVar23 = iVar23 + 1;
    }
    *(undefined4 *)(local_780 + (uint)(iVar23 << 2)) = 0;
    uVar2 = (&uStack_140)[uVar86 * 0xc];
    auVar96._8_8_ = 0;
    auVar96._0_8_ = uVar2;
    local_c84 = aiStack_138[uVar86 * 0x18];
    *(undefined1 (*) [32])(auStack_180 + lVar88) = _local_780;
    uVar87 = uVar84 - 1;
    if ((((((((_local_780 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (_local_780 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (_local_780 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(_local_780 >> 0x7f,0) != '\0') ||
          (_local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(_local_780 >> 0xbf,0) != '\0') ||
        (_local_780 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_780[0x1f] < '\0') {
      uVar87 = uVar84;
    }
    uVar90 = (undefined4)uVar2;
    auVar142._4_4_ = uVar90;
    auVar142._0_4_ = uVar90;
    auVar142._8_4_ = uVar90;
    auVar142._12_4_ = uVar90;
    auVar142._16_4_ = uVar90;
    auVar142._20_4_ = uVar90;
    auVar142._24_4_ = uVar90;
    auVar142._28_4_ = uVar90;
    auVar101 = vmovshdup_avx(auVar96);
    auVar101 = vsubps_avx(auVar101,auVar96);
    auVar117._0_4_ = auVar101._0_4_;
    auVar117._4_4_ = auVar117._0_4_;
    auVar117._8_4_ = auVar117._0_4_;
    auVar117._12_4_ = auVar117._0_4_;
    auVar117._16_4_ = auVar117._0_4_;
    auVar117._20_4_ = auVar117._0_4_;
    auVar117._24_4_ = auVar117._0_4_;
    auVar117._28_4_ = auVar117._0_4_;
    auVar101 = vfmadd132ps_fma(auVar117,auVar142,_DAT_01f7b040);
    local_4e0 = ZEXT1632(auVar101);
    local_610._8_8_ = 0;
    local_610._0_8_ = *(ulong *)(local_4e0 + (uint)(iVar23 << 2));
    uVar86 = (ulong)uVar87;
    auVar248 = auVar284._0_32_;
  } while( true );
}

Assistant:

static __forceinline void intersect_h(Precalculations& pre, RayHitK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(normal.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff p0,t0,p1,t1; geom->gather_hermite(p0,t0,p1,t1,geom->curve(primID),ray.time()[k]);
          Intersector().intersect(pre,ray,k,context,geom,primID,p0,t0,p1,t1,Epilog(ray,k,context,geomID,primID));
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
      }